

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  bool bVar27;
  bool bVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar46 [16];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar47 [16];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  int iVar93;
  float fVar94;
  float fVar98;
  vint4 bi_2;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined4 uVar99;
  vint4 bi_1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  float fVar123;
  float fVar124;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  vint4 ai_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar146;
  vint4 bi;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vfloat4 b0_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  vfloat4 a0_3;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  vfloat4 a0_2;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar211;
  float fVar212;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [64];
  vfloat4 a0;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  vfloat4 a0_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  int iVar252;
  undefined1 in_ZMM29 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5a1;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  uint auStack_420 [4];
  RTCFilterFunctionNArguments local_410;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar21;
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  
  PVar3 = prim[1];
  uVar20 = (ulong)(byte)PVar3;
  fVar94 = *(float *)(prim + uVar20 * 0x19 + 0x12);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar33 = vsubps_avx(auVar33,*(undefined1 (*) [16])(prim + uVar20 * 0x19 + 6));
  auVar54._0_4_ = fVar94 * auVar33._0_4_;
  auVar54._4_4_ = fVar94 * auVar33._4_4_;
  auVar54._8_4_ = fVar94 * auVar33._8_4_;
  auVar54._12_4_ = fVar94 * auVar33._12_4_;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 4 + 6)));
  auVar40._0_4_ = fVar94 * auVar34._0_4_;
  auVar40._4_4_ = fVar94 * auVar34._4_4_;
  auVar40._8_4_ = fVar94 * auVar34._8_4_;
  auVar40._12_4_ = fVar94 * auVar34._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 5 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 6 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 * 0xb + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar20 + 6)));
  uVar29 = (ulong)(uint)((int)(uVar20 * 9) * 2);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 + uVar20 + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  uVar25 = (ulong)(uint)((int)(uVar20 * 5) << 2);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar57._4_4_ = auVar40._0_4_;
  auVar57._0_4_ = auVar40._0_4_;
  auVar57._8_4_ = auVar40._0_4_;
  auVar57._12_4_ = auVar40._0_4_;
  auVar38 = vshufps_avx(auVar40,auVar40,0x55);
  auVar36 = vshufps_avx(auVar40,auVar40,0xaa);
  fVar94 = auVar36._0_4_;
  auVar56._0_4_ = fVar94 * auVar30._0_4_;
  fVar98 = auVar36._4_4_;
  auVar56._4_4_ = fVar98 * auVar30._4_4_;
  fVar215 = auVar36._8_4_;
  auVar56._8_4_ = fVar215 * auVar30._8_4_;
  fVar200 = auVar36._12_4_;
  auVar56._12_4_ = fVar200 * auVar30._12_4_;
  auVar45._0_4_ = auVar31._0_4_ * fVar94;
  auVar45._4_4_ = auVar31._4_4_ * fVar98;
  auVar45._8_4_ = auVar31._8_4_ * fVar215;
  auVar45._12_4_ = auVar31._12_4_ * fVar200;
  auVar41._0_4_ = auVar32._0_4_ * fVar94;
  auVar41._4_4_ = auVar32._4_4_ * fVar98;
  auVar41._8_4_ = auVar32._8_4_ * fVar215;
  auVar41._12_4_ = auVar32._12_4_ * fVar200;
  auVar36 = vfmadd231ps_fma(auVar56,auVar38,auVar34);
  auVar37 = vfmadd231ps_fma(auVar45,auVar38,auVar44);
  auVar38 = vfmadd231ps_fma(auVar41,auVar42,auVar38);
  auVar39 = vfmadd231ps_fma(auVar36,auVar57,auVar33);
  auVar37 = vfmadd231ps_fma(auVar37,auVar57,auVar35);
  auVar40 = vfmadd231ps_fma(auVar38,auVar43,auVar57);
  auVar240._4_4_ = auVar54._0_4_;
  auVar240._0_4_ = auVar54._0_4_;
  auVar240._8_4_ = auVar54._0_4_;
  auVar240._12_4_ = auVar54._0_4_;
  auVar38 = vshufps_avx(auVar54,auVar54,0x55);
  auVar36 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar75._16_16_ = in_YmmResult._16_16_;
  auVar30 = vmulps_avx512vl(auVar36,auVar30);
  auVar46._0_4_ = auVar36._0_4_ * auVar31._0_4_;
  auVar46._4_4_ = auVar36._4_4_ * auVar31._4_4_;
  auVar46._8_4_ = auVar36._8_4_ * auVar31._8_4_;
  auVar46._12_4_ = auVar36._12_4_ * auVar31._12_4_;
  auVar52._0_4_ = auVar36._0_4_ * auVar32._0_4_;
  auVar52._4_4_ = auVar36._4_4_ * auVar32._4_4_;
  auVar52._8_4_ = auVar36._8_4_ * auVar32._8_4_;
  auVar52._12_4_ = auVar36._12_4_ * auVar32._12_4_;
  auVar31 = vfmadd231ps_avx512vl(auVar30,auVar38,auVar34);
  auVar34 = vfmadd231ps_fma(auVar46,auVar38,auVar44);
  auVar30 = vfmadd231ps_fma(auVar52,auVar38,auVar42);
  auVar32 = vfmadd231ps_avx512vl(auVar31,auVar240,auVar33);
  auVar31 = vfmadd231ps_fma(auVar34,auVar240,auVar35);
  auVar42 = vfmadd231ps_fma(auVar30,auVar240,auVar43);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar251 = ZEXT1664(auVar33);
  auVar34 = vandps_avx512vl(auVar39,auVar33);
  auVar49._8_4_ = 0x219392ef;
  auVar49._0_8_ = 0x219392ef219392ef;
  auVar49._12_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar34,auVar49,1);
  bVar27 = (bool)((byte)uVar29 & 1);
  auVar36._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar39._0_4_;
  bVar27 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar39._4_4_;
  bVar27 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar39._8_4_;
  bVar27 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar39._12_4_;
  auVar34 = vandps_avx512vl(auVar37,auVar33);
  uVar29 = vcmpps_avx512vl(auVar34,auVar49,1);
  bVar27 = (bool)((byte)uVar29 & 1);
  auVar39._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar37._0_4_;
  bVar27 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar37._4_4_;
  bVar27 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar37._8_4_;
  bVar27 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar37._12_4_;
  auVar33 = vandps_avx512vl(auVar40,auVar33);
  uVar29 = vcmpps_avx512vl(auVar33,auVar49,1);
  bVar27 = (bool)((byte)uVar29 & 1);
  auVar37._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar40._0_4_;
  bVar27 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar40._4_4_;
  bVar27 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar40._8_4_;
  bVar27 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar37._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar40._12_4_;
  auVar34 = vrcp14ps_avx512vl(auVar36);
  auVar50._8_4_ = 0x3f800000;
  auVar50._0_8_ = &DAT_3f8000003f800000;
  auVar50._12_4_ = 0x3f800000;
  auVar33 = vfnmadd213ps_fma(auVar36,auVar34,auVar50);
  auVar30 = vfmadd132ps_fma(auVar33,auVar34,auVar34);
  auVar34 = vrcp14ps_avx512vl(auVar39);
  auVar33 = vfnmadd213ps_fma(auVar39,auVar34,auVar50);
  auVar44 = vfmadd132ps_fma(auVar33,auVar34,auVar34);
  auVar34 = vrcp14ps_avx512vl(auVar37);
  auVar33 = vfnmadd213ps_fma(auVar37,auVar34,auVar50);
  auVar43 = vfmadd132ps_fma(auVar33,auVar34,auVar34);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar20 * 7 + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar35 = vsubps_avx512vl(auVar33,auVar32);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar20 * 9 + 6);
  auVar33 = vpmovsxwd_avx(auVar34);
  auVar48._0_4_ = auVar30._0_4_ * auVar35._0_4_;
  auVar48._4_4_ = auVar30._4_4_ * auVar35._4_4_;
  auVar48._8_4_ = auVar30._8_4_ * auVar35._8_4_;
  auVar48._12_4_ = auVar30._12_4_ * auVar35._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx512vl(auVar33,auVar32);
  auVar53._0_4_ = auVar30._0_4_ * auVar33._0_4_;
  auVar53._4_4_ = auVar30._4_4_ * auVar33._4_4_;
  auVar53._8_4_ = auVar30._8_4_ * auVar33._8_4_;
  auVar53._12_4_ = auVar30._12_4_ * auVar33._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar34 = vpmovsxwd_avx(auVar30);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar20 * -2 + 6);
  auVar33 = vpmovsxwd_avx(auVar35);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar31);
  auVar51._0_4_ = auVar44._0_4_ * auVar33._0_4_;
  auVar51._4_4_ = auVar44._4_4_ * auVar33._4_4_;
  auVar51._8_4_ = auVar44._8_4_ * auVar33._8_4_;
  auVar51._12_4_ = auVar44._12_4_ * auVar33._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar34);
  auVar33 = vsubps_avx(auVar33,auVar31);
  auVar47._0_4_ = auVar44._0_4_ * auVar33._0_4_;
  auVar47._4_4_ = auVar44._4_4_ * auVar33._4_4_;
  auVar47._8_4_ = auVar44._8_4_ * auVar33._8_4_;
  auVar47._12_4_ = auVar44._12_4_ * auVar33._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar25 + uVar20 + 6);
  auVar33 = vpmovsxwd_avx(auVar44);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar42);
  auVar55._0_4_ = auVar43._0_4_ * auVar33._0_4_;
  auVar55._4_4_ = auVar43._4_4_ * auVar33._4_4_;
  auVar55._8_4_ = auVar43._8_4_ * auVar33._8_4_;
  auVar55._12_4_ = auVar43._12_4_ * auVar33._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar20 * 0x17 + 6);
  auVar33 = vpmovsxwd_avx(auVar31);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar33 = vsubps_avx(auVar33,auVar42);
  auVar95._0_4_ = auVar43._0_4_ * auVar33._0_4_;
  auVar95._4_4_ = auVar43._4_4_ * auVar33._4_4_;
  auVar95._8_4_ = auVar43._8_4_ * auVar33._8_4_;
  auVar95._12_4_ = auVar43._12_4_ * auVar33._12_4_;
  auVar33 = vpminsd_avx(auVar48,auVar53);
  auVar34 = vpminsd_avx(auVar51,auVar47);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar34 = vpminsd_avx(auVar55,auVar95);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar43._4_4_ = uVar99;
  auVar43._0_4_ = uVar99;
  auVar43._8_4_ = uVar99;
  auVar43._12_4_ = uVar99;
  auVar34 = vmaxps_avx512vl(auVar34,auVar43);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar42._8_4_ = 0x3f7ffffa;
  auVar42._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar42._12_4_ = 0x3f7ffffa;
  local_380 = vmulps_avx512vl(auVar33,auVar42);
  auVar33 = vpmaxsd_avx(auVar48,auVar53);
  auVar34 = vpmaxsd_avx(auVar51,auVar47);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar34 = vpmaxsd_avx(auVar55,auVar95);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar32._4_4_ = uVar99;
  auVar32._0_4_ = uVar99;
  auVar32._8_4_ = uVar99;
  auVar32._12_4_ = uVar99;
  auVar34 = vminps_avx512vl(auVar34,auVar32);
  auVar33 = vminps_avx(auVar33,auVar34);
  auVar38._8_4_ = 0x3f800003;
  auVar38._0_8_ = 0x3f8000033f800003;
  auVar38._12_4_ = 0x3f800003;
  auVar33 = vmulps_avx512vl(auVar33,auVar38);
  auVar34 = vpbroadcastd_avx512vl();
  uVar9 = vcmpps_avx512vl(local_380,auVar33,2);
  uVar29 = vpcmpgtd_avx512vl(auVar34,_DAT_01ff0cf0);
  uVar29 = ((byte)uVar9 & 0xf) & uVar29;
  bVar27 = (char)uVar29 == '\0';
  local_5a1 = !bVar27;
  if (bVar27) {
    return local_5a1;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar254 = ZEXT1664(auVar33);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar249 = ZEXT1664(auVar33);
  auVar75._0_16_ = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar253 = ZEXT1664(auVar75._0_16_);
LAB_01b78d03:
  lVar23 = 0;
  for (uVar20 = uVar29; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar26 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar26].ptr;
  uVar20 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar23 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar33 = *(undefined1 (*) [16])(_Var8 + uVar20 * (long)pvVar7);
  auVar34 = *(undefined1 (*) [16])(_Var8 + (uVar20 + 1) * (long)pvVar7);
  auVar30 = *(undefined1 (*) [16])(_Var8 + (uVar20 + 2) * (long)pvVar7);
  auVar35 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar20 + 3));
  lVar23 = *(long *)&pGVar5[1].time_range.upper;
  auVar44 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * uVar20);
  auVar31 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar20 + 1));
  auVar43 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar20 + 2));
  uVar29 = uVar29 - 1 & uVar29;
  auVar42 = *(undefined1 (*) [16])(lVar23 + (long)p_Var6 * (uVar20 + 3));
  if (uVar29 != 0) {
    uVar25 = uVar29 - 1 & uVar29;
    for (uVar20 = uVar29; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
    }
    if (uVar25 != 0) {
      for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar72._16_16_ = auVar75._16_16_;
  auVar45 = auVar254._0_16_;
  auVar36 = vmulps_avx512vl(auVar42,auVar45);
  auVar38 = vfmadd213ps_fma((undefined1  [16])0x0,auVar43,auVar36);
  auVar100._0_4_ = auVar31._0_4_ + auVar38._0_4_;
  auVar100._4_4_ = auVar31._4_4_ + auVar38._4_4_;
  auVar100._8_4_ = auVar31._8_4_ + auVar38._8_4_;
  auVar100._12_4_ = auVar31._12_4_ + auVar38._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar100,auVar44,auVar45);
  auVar72._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar38 = vmulps_avx512vl(auVar42,auVar72._0_16_);
  auVar95 = auVar249._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar43,auVar95);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar31,auVar72._0_16_);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar44,auVar95);
  auVar40 = vmulps_avx512vl(auVar35,auVar45);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar30,auVar40);
  auVar241._0_4_ = auVar38._0_4_ + auVar34._0_4_;
  auVar241._4_4_ = auVar38._4_4_ + auVar34._4_4_;
  auVar241._8_4_ = auVar38._8_4_ + auVar34._8_4_;
  auVar241._12_4_ = auVar38._12_4_ + auVar34._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar241,auVar33,auVar45);
  auVar41 = vmulps_avx512vl(auVar35,auVar72._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar30,auVar95);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar34,auVar72._0_16_);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar33,auVar95);
  auVar125._0_4_ = auVar43._0_4_ + auVar36._0_4_;
  auVar125._4_4_ = auVar43._4_4_ + auVar36._4_4_;
  auVar125._8_4_ = auVar43._8_4_ + auVar36._8_4_;
  auVar125._12_4_ = auVar43._12_4_ + auVar36._12_4_;
  auVar36 = vfmadd231ps_avx512vl(auVar125,auVar31,auVar72._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar44,auVar45);
  auVar42 = vmulps_avx512vl(auVar42,auVar95);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar72._0_16_,auVar43);
  auVar31 = vfnmadd231ps_avx512vl(auVar43,auVar95,auVar31);
  auVar43 = vfmadd231ps_avx512vl(auVar31,auVar72._0_16_,auVar44);
  auVar193._0_4_ = auVar40._0_4_ + auVar30._0_4_;
  auVar193._4_4_ = auVar40._4_4_ + auVar30._4_4_;
  auVar193._8_4_ = auVar40._8_4_ + auVar30._8_4_;
  auVar193._12_4_ = auVar40._12_4_ + auVar30._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar193,auVar34,auVar72._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar33,auVar45);
  auVar35 = vmulps_avx512vl(auVar35,auVar95);
  auVar30 = vfmadd231ps_avx512vl(auVar35,auVar72._0_16_,auVar30);
  auVar34 = vfnmadd231ps_avx512vl(auVar30,auVar95,auVar34);
  auVar31 = vfmadd231ps_avx512vl(auVar34,auVar72._0_16_,auVar33);
  auVar33 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar34 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar211 = auVar39._0_4_;
  auVar156._0_4_ = fVar211 * auVar34._0_4_;
  fVar212 = auVar39._4_4_;
  auVar156._4_4_ = fVar212 * auVar34._4_4_;
  fVar123 = auVar39._8_4_;
  auVar156._8_4_ = fVar123 * auVar34._8_4_;
  fVar124 = auVar39._12_4_;
  auVar156._12_4_ = fVar124 * auVar34._12_4_;
  auVar34 = vfmsub231ps_fma(auVar156,auVar33,auVar38);
  auVar30 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar157._0_4_ = fVar211 * auVar34._0_4_;
  auVar157._4_4_ = fVar212 * auVar34._4_4_;
  auVar157._8_4_ = fVar123 * auVar34._8_4_;
  auVar157._12_4_ = fVar124 * auVar34._12_4_;
  auVar33 = vfmsub231ps_fma(auVar157,auVar33,auVar41);
  auVar35 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar34 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar139 = auVar43._0_4_;
  auVar147._0_4_ = fVar139 * auVar34._0_4_;
  fVar146 = auVar43._4_4_;
  auVar147._4_4_ = fVar146 * auVar34._4_4_;
  fVar213 = auVar43._8_4_;
  auVar147._8_4_ = fVar213 * auVar34._8_4_;
  fVar214 = auVar43._12_4_;
  auVar147._12_4_ = fVar214 * auVar34._12_4_;
  auVar34 = vfmsub231ps_fma(auVar147,auVar33,auVar44);
  auVar44 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar194._0_4_ = auVar34._0_4_ * fVar139;
  auVar194._4_4_ = auVar34._4_4_ * fVar146;
  auVar194._8_4_ = auVar34._8_4_ * fVar213;
  auVar194._12_4_ = auVar34._12_4_ * fVar214;
  auVar33 = vfmsub231ps_fma(auVar194,auVar33,auVar31);
  auVar31 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vdpps_avx(auVar30,auVar30,0x7f);
  fVar98 = auVar33._0_4_;
  auVar58._4_28_ = auVar72._4_28_;
  auVar58._0_4_ = fVar98;
  auVar34 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar58._0_16_);
  fVar94 = auVar34._0_4_;
  auVar34 = vmulss_avx512f(auVar33,ZEXT416(0xbf000000));
  fVar94 = fVar94 * 1.5 + auVar34._0_4_ * fVar94 * fVar94 * fVar94;
  fVar227 = fVar94 * auVar30._0_4_;
  fVar237 = fVar94 * auVar30._4_4_;
  fVar238 = fVar94 * auVar30._8_4_;
  fVar239 = fVar94 * auVar30._12_4_;
  auVar34 = vdpps_avx(auVar30,auVar35,0x7f);
  auVar201._0_4_ = auVar35._0_4_ * fVar98;
  auVar201._4_4_ = auVar35._4_4_ * fVar98;
  auVar201._8_4_ = auVar35._8_4_ * fVar98;
  auVar201._12_4_ = auVar35._12_4_ * fVar98;
  fVar98 = auVar34._0_4_;
  auVar166._0_4_ = fVar98 * auVar30._0_4_;
  auVar166._4_4_ = fVar98 * auVar30._4_4_;
  auVar166._8_4_ = fVar98 * auVar30._8_4_;
  auVar166._12_4_ = fVar98 * auVar30._12_4_;
  auVar30 = vsubps_avx(auVar201,auVar166);
  auVar34 = vrcp14ss_avx512f(auVar72._0_16_,auVar58._0_16_);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
  fVar215 = auVar34._0_4_ * auVar33._0_4_;
  auVar33 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar200 = auVar33._0_4_;
  auVar73._16_16_ = auVar72._16_16_;
  auVar73._0_16_ = auVar72._0_16_;
  auVar74._4_28_ = auVar73._4_28_;
  auVar74._0_4_ = fVar200;
  auVar34 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar74._0_16_);
  fVar98 = auVar34._0_4_;
  auVar34 = vmulss_avx512f(auVar33,ZEXT416(0xbf000000));
  fVar98 = fVar98 * 1.5 + auVar34._0_4_ * fVar98 * fVar98 * fVar98;
  fVar216 = fVar98 * auVar44._0_4_;
  fVar224 = fVar98 * auVar44._4_4_;
  fVar225 = fVar98 * auVar44._8_4_;
  fVar226 = fVar98 * auVar44._12_4_;
  auVar34 = vdpps_avx(auVar44,auVar31,0x7f);
  auVar158._0_4_ = fVar200 * auVar31._0_4_;
  auVar158._4_4_ = fVar200 * auVar31._4_4_;
  auVar158._8_4_ = fVar200 * auVar31._8_4_;
  auVar158._12_4_ = fVar200 * auVar31._12_4_;
  fVar200 = auVar34._0_4_;
  auVar148._0_4_ = fVar200 * auVar44._0_4_;
  auVar148._4_4_ = fVar200 * auVar44._4_4_;
  auVar148._8_4_ = fVar200 * auVar44._8_4_;
  auVar148._12_4_ = fVar200 * auVar44._12_4_;
  auVar35 = vsubps_avx(auVar158,auVar148);
  auVar34 = vrcp14ss_avx512f(auVar72._0_16_,auVar74._0_16_);
  auVar33 = vfnmadd213ss_avx512f(auVar33,auVar34,ZEXT416(0x40000000));
  fVar200 = auVar33._0_4_ * auVar34._0_4_;
  auVar33 = vshufps_avx(auVar37,auVar37,0xff);
  auVar184._0_4_ = fVar227 * auVar33._0_4_;
  auVar184._4_4_ = fVar237 * auVar33._4_4_;
  auVar184._8_4_ = fVar238 * auVar33._8_4_;
  auVar184._12_4_ = fVar239 * auVar33._12_4_;
  local_300 = vsubps_avx(auVar37,auVar184);
  auVar34 = vshufps_avx(auVar39,auVar39,0xff);
  auVar159._0_4_ = auVar34._0_4_ * fVar227 + auVar33._0_4_ * fVar94 * fVar215 * auVar30._0_4_;
  auVar159._4_4_ = auVar34._4_4_ * fVar237 + auVar33._4_4_ * fVar94 * fVar215 * auVar30._4_4_;
  auVar159._8_4_ = auVar34._8_4_ * fVar238 + auVar33._8_4_ * fVar94 * fVar215 * auVar30._8_4_;
  auVar159._12_4_ = auVar34._12_4_ * fVar239 + auVar33._12_4_ * fVar94 * fVar215 * auVar30._12_4_;
  auVar30 = vsubps_avx(auVar39,auVar159);
  local_310._0_4_ = auVar184._0_4_ + auVar37._0_4_;
  local_310._4_4_ = auVar184._4_4_ + auVar37._4_4_;
  fStack_308 = auVar184._8_4_ + auVar37._8_4_;
  fStack_304 = auVar184._12_4_ + auVar37._12_4_;
  auVar33 = vshufps_avx(auVar36,auVar36,0xff);
  auVar160._0_4_ = fVar216 * auVar33._0_4_;
  auVar160._4_4_ = fVar224 * auVar33._4_4_;
  auVar160._8_4_ = fVar225 * auVar33._8_4_;
  auVar160._12_4_ = fVar226 * auVar33._12_4_;
  local_320 = vsubps_avx(auVar36,auVar160);
  auVar34 = vshufps_avx(auVar43,auVar43,0xff);
  auVar112._0_4_ = auVar34._0_4_ * fVar216 + auVar33._0_4_ * fVar98 * auVar35._0_4_ * fVar200;
  auVar112._4_4_ = auVar34._4_4_ * fVar224 + auVar33._4_4_ * fVar98 * auVar35._4_4_ * fVar200;
  auVar112._8_4_ = auVar34._8_4_ * fVar225 + auVar33._8_4_ * fVar98 * auVar35._8_4_ * fVar200;
  auVar112._12_4_ = auVar34._12_4_ * fVar226 + auVar33._12_4_ * fVar98 * auVar35._12_4_ * fVar200;
  auVar33 = vsubps_avx(auVar43,auVar112);
  _local_330 = vaddps_avx512vl(auVar36,auVar160);
  auVar126._0_4_ = auVar30._0_4_ * 0.33333334;
  auVar126._4_4_ = auVar30._4_4_ * 0.33333334;
  auVar126._8_4_ = auVar30._8_4_ * 0.33333334;
  auVar126._12_4_ = auVar30._12_4_ * 0.33333334;
  local_340 = vaddps_avx512vl(local_300,auVar126);
  auVar127._0_4_ = auVar33._0_4_ * 0.33333334;
  auVar127._4_4_ = auVar33._4_4_ * 0.33333334;
  auVar127._8_4_ = auVar33._8_4_ * 0.33333334;
  auVar127._12_4_ = auVar33._12_4_ * 0.33333334;
  local_350 = vsubps_avx512vl(local_320,auVar127);
  auVar101._0_4_ = (fVar211 + auVar159._0_4_) * 0.33333334;
  auVar101._4_4_ = (fVar212 + auVar159._4_4_) * 0.33333334;
  auVar101._8_4_ = (fVar123 + auVar159._8_4_) * 0.33333334;
  auVar101._12_4_ = (fVar124 + auVar159._12_4_) * 0.33333334;
  _local_360 = vaddps_avx512vl(_local_310,auVar101);
  auVar102._0_4_ = (fVar139 + auVar112._0_4_) * 0.33333334;
  auVar102._4_4_ = (fVar146 + auVar112._4_4_) * 0.33333334;
  auVar102._8_4_ = (fVar213 + auVar112._8_4_) * 0.33333334;
  auVar102._12_4_ = (fVar214 + auVar112._12_4_) * 0.33333334;
  _local_370 = vsubps_avx512vl(_local_330,auVar102);
  local_280 = vsubps_avx(local_300,auVar32);
  uVar99 = local_280._0_4_;
  auVar113._4_4_ = uVar99;
  auVar113._0_4_ = uVar99;
  auVar113._8_4_ = uVar99;
  auVar113._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_280,local_280,0x55);
  auVar34 = vshufps_avx(local_280,local_280,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar94 = pre->ray_space[k].vz.field_0.m128[0];
  fVar98 = pre->ray_space[k].vz.field_0.m128[1];
  fVar215 = pre->ray_space[k].vz.field_0.m128[2];
  fVar200 = pre->ray_space[k].vz.field_0.m128[3];
  auVar103._0_4_ = fVar94 * auVar34._0_4_;
  auVar103._4_4_ = fVar98 * auVar34._4_4_;
  auVar103._8_4_ = fVar215 * auVar34._8_4_;
  auVar103._12_4_ = fVar200 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar2,auVar33);
  auVar38 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar113);
  local_290 = vsubps_avx512vl(local_340,auVar32);
  uVar99 = local_290._0_4_;
  auVar128._4_4_ = uVar99;
  auVar128._0_4_ = uVar99;
  auVar128._8_4_ = uVar99;
  auVar128._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_290,local_290,0x55);
  auVar34 = vshufps_avx(local_290,local_290,0xaa);
  auVar114._0_4_ = fVar94 * auVar34._0_4_;
  auVar114._4_4_ = fVar98 * auVar34._4_4_;
  auVar114._8_4_ = fVar215 * auVar34._8_4_;
  auVar114._12_4_ = fVar200 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar2,auVar33);
  auVar36 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar128);
  local_2a0 = vsubps_avx512vl(local_350,auVar32);
  uVar99 = local_2a0._0_4_;
  auVar167._4_4_ = uVar99;
  auVar167._0_4_ = uVar99;
  auVar167._8_4_ = uVar99;
  auVar167._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar34 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar129._0_4_ = fVar94 * auVar34._0_4_;
  auVar129._4_4_ = fVar98 * auVar34._4_4_;
  auVar129._8_4_ = fVar215 * auVar34._8_4_;
  auVar129._12_4_ = fVar200 * auVar34._12_4_;
  auVar33 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar2,auVar33);
  auVar37 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar167);
  local_2b0 = vsubps_avx(local_320,auVar32);
  uVar99 = local_2b0._0_4_;
  auVar168._4_4_ = uVar99;
  auVar168._0_4_ = uVar99;
  auVar168._8_4_ = uVar99;
  auVar168._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar34 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar195._0_4_ = auVar34._0_4_ * fVar94;
  auVar195._4_4_ = auVar34._4_4_ * fVar98;
  auVar195._8_4_ = auVar34._8_4_ * fVar215;
  auVar195._12_4_ = auVar34._12_4_ * fVar200;
  auVar33 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar2,auVar33);
  auVar39 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar168);
  local_2c0 = vsubps_avx(_local_310,auVar32);
  uVar99 = local_2c0._0_4_;
  auVar169._4_4_ = uVar99;
  auVar169._0_4_ = uVar99;
  auVar169._8_4_ = uVar99;
  auVar169._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar34 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar202._0_4_ = auVar34._0_4_ * fVar94;
  auVar202._4_4_ = auVar34._4_4_ * fVar98;
  auVar202._8_4_ = auVar34._8_4_ * fVar215;
  auVar202._12_4_ = auVar34._12_4_ * fVar200;
  auVar33 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar2,auVar33);
  auVar40 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar169);
  local_2d0 = vsubps_avx512vl(_local_360,auVar32);
  uVar99 = local_2d0._0_4_;
  auVar170._4_4_ = uVar99;
  auVar170._0_4_ = uVar99;
  auVar170._8_4_ = uVar99;
  auVar170._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar34 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar217._0_4_ = auVar34._0_4_ * fVar94;
  auVar217._4_4_ = auVar34._4_4_ * fVar98;
  auVar217._8_4_ = auVar34._8_4_ * fVar215;
  auVar217._12_4_ = auVar34._12_4_ * fVar200;
  auVar33 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar33);
  auVar41 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar170);
  local_2e0 = vsubps_avx512vl(_local_370,auVar32);
  uVar99 = local_2e0._0_4_;
  auVar171._4_4_ = uVar99;
  auVar171._0_4_ = uVar99;
  auVar171._8_4_ = uVar99;
  auVar171._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar34 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar228._0_4_ = auVar34._0_4_ * fVar94;
  auVar228._4_4_ = auVar34._4_4_ * fVar98;
  auVar228._8_4_ = auVar34._8_4_ * fVar215;
  auVar228._12_4_ = auVar34._12_4_ * fVar200;
  auVar33 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar2,auVar33);
  auVar95 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar171);
  local_2f0 = vsubps_avx512vl(_local_330,auVar32);
  uVar99 = local_2f0._0_4_;
  auVar96._4_4_ = uVar99;
  auVar96._0_4_ = uVar99;
  auVar96._8_4_ = uVar99;
  auVar96._12_4_ = uVar99;
  auVar33 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar34 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar161._0_4_ = auVar34._0_4_ * fVar94;
  auVar161._4_4_ = auVar34._4_4_ * fVar98;
  auVar161._8_4_ = auVar34._8_4_ * fVar215;
  auVar161._12_4_ = auVar34._12_4_ * fVar200;
  auVar33 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar2,auVar33);
  auVar32 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar1,auVar96);
  auVar30 = vmovlhps_avx(auVar38,auVar40);
  auVar31 = vmovlhps_avx512f(auVar36,auVar41);
  auVar43 = vmovlhps_avx512f(auVar37,auVar95);
  auVar42 = vmovlhps_avx512f(auVar39,auVar32);
  auVar33 = vminps_avx512vl(auVar30,auVar31);
  auVar35 = vmaxps_avx512vl(auVar30,auVar31);
  auVar34 = vminps_avx512vl(auVar43,auVar42);
  auVar34 = vminps_avx(auVar33,auVar34);
  auVar33 = vmaxps_avx512vl(auVar43,auVar42);
  auVar33 = vmaxps_avx(auVar35,auVar33);
  auVar35 = vshufpd_avx(auVar34,auVar34,3);
  auVar44 = vshufpd_avx(auVar33,auVar33,3);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar33 = vmaxps_avx(auVar33,auVar44);
  auVar34 = vandps_avx512vl(auVar34,auVar251._0_16_);
  auVar33 = vandps_avx512vl(auVar33,auVar251._0_16_);
  auVar33 = vmaxps_avx(auVar34,auVar33);
  auVar34 = vmovshdup_avx(auVar33);
  auVar33 = vmaxss_avx(auVar34,auVar33);
  fVar98 = auVar33._0_4_ * 9.536743e-07;
  auVar172._8_8_ = auVar38._0_8_;
  auVar172._0_8_ = auVar38._0_8_;
  auVar34 = vmovddup_avx512vl(auVar36);
  auVar35 = vmovddup_avx512vl(auVar37);
  auVar104._8_8_ = auVar39._0_8_;
  auVar104._0_8_ = auVar39._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar98));
  auVar33 = vxorps_avx512vl(local_1c0._0_16_,auVar45);
  local_1e0 = vbroadcastss_avx512vl(auVar33);
  local_200 = vpbroadcastd_avx512vl();
  bVar27 = false;
  uVar20 = 0;
  fVar94 = *(float *)(ray + k * 4 + 0x60);
  auVar44 = vsubps_avx512vl(auVar31,auVar30);
  auVar79._0_16_ = vsubps_avx512vl(auVar43,auVar31);
  local_270 = vsubps_avx512vl(auVar42,auVar43);
  local_390 = vsubps_avx(_local_310,local_300);
  local_3a0 = vsubps_avx512vl(_local_360,local_340);
  local_3b0 = vsubps_avx512vl(_local_370,local_350);
  _local_3c0 = vsubps_avx512vl(_local_330,local_320);
  local_220 = vpbroadcastd_avx512vl();
  auVar33 = ZEXT816(0x3f80000000000000);
  auVar236 = ZEXT1664(auVar33);
  do {
    auVar54 = auVar236._0_16_;
    auVar38 = vshufps_avx(auVar54,auVar54,0x50);
    auVar242._8_4_ = 0x3f800000;
    auVar242._0_8_ = &DAT_3f8000003f800000;
    auVar242._12_4_ = 0x3f800000;
    auVar136._16_4_ = 0x3f800000;
    auVar136._0_16_ = auVar242;
    auVar136._20_4_ = 0x3f800000;
    auVar136._24_4_ = 0x3f800000;
    auVar136._28_4_ = 0x3f800000;
    auVar36 = vsubps_avx(auVar242,auVar38);
    fVar215 = auVar38._0_4_;
    fVar123 = auVar40._0_4_;
    auVar130._0_4_ = fVar123 * fVar215;
    fVar200 = auVar38._4_4_;
    fVar124 = auVar40._4_4_;
    auVar130._4_4_ = fVar124 * fVar200;
    fVar211 = auVar38._8_4_;
    auVar130._8_4_ = fVar123 * fVar211;
    fVar212 = auVar38._12_4_;
    auVar130._12_4_ = fVar124 * fVar212;
    fVar139 = auVar41._0_4_;
    auVar140._0_4_ = fVar139 * fVar215;
    fVar146 = auVar41._4_4_;
    auVar140._4_4_ = fVar146 * fVar200;
    auVar140._8_4_ = fVar139 * fVar211;
    auVar140._12_4_ = fVar146 * fVar212;
    fVar224 = auVar95._0_4_;
    auVar149._0_4_ = fVar224 * fVar215;
    fVar225 = auVar95._4_4_;
    auVar149._4_4_ = fVar225 * fVar200;
    auVar149._8_4_ = fVar224 * fVar211;
    auVar149._12_4_ = fVar225 * fVar212;
    fVar226 = auVar32._0_4_;
    auVar105._0_4_ = fVar226 * fVar215;
    fVar227 = auVar32._4_4_;
    auVar105._4_4_ = fVar227 * fVar200;
    auVar105._8_4_ = fVar226 * fVar211;
    auVar105._12_4_ = fVar227 * fVar212;
    auVar37 = vfmadd231ps_fma(auVar130,auVar36,auVar172);
    auVar39 = vfmadd231ps_avx512vl(auVar140,auVar36,auVar34);
    auVar45 = vfmadd231ps_avx512vl(auVar149,auVar36,auVar35);
    auVar36 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar36);
    auVar38 = vmovshdup_avx(auVar33);
    fVar200 = auVar33._0_4_;
    fVar215 = (auVar38._0_4_ - fVar200) * 0.04761905;
    auVar71._4_4_ = fVar200;
    auVar71._0_4_ = fVar200;
    auVar71._8_4_ = fVar200;
    auVar71._12_4_ = fVar200;
    auVar71._16_4_ = fVar200;
    auVar71._20_4_ = fVar200;
    auVar71._24_4_ = fVar200;
    auVar71._28_4_ = fVar200;
    auVar66._0_8_ = auVar38._0_8_;
    auVar66._8_8_ = auVar66._0_8_;
    auVar66._16_8_ = auVar66._0_8_;
    auVar66._24_8_ = auVar66._0_8_;
    auVar75 = vsubps_avx(auVar66,auVar71);
    uVar99 = auVar37._0_4_;
    auVar77._4_4_ = uVar99;
    auVar77._0_4_ = uVar99;
    auVar77._8_4_ = uVar99;
    auVar77._12_4_ = uVar99;
    auVar77._16_4_ = uVar99;
    auVar77._20_4_ = uVar99;
    auVar77._24_4_ = uVar99;
    auVar77._28_4_ = uVar99;
    auVar67._8_4_ = 1;
    auVar67._0_8_ = 0x100000001;
    auVar67._12_4_ = 1;
    auVar67._16_4_ = 1;
    auVar67._20_4_ = 1;
    auVar67._24_4_ = 1;
    auVar67._28_4_ = 1;
    auVar73 = ZEXT1632(auVar37);
    auVar72 = vpermps_avx2(auVar67,auVar73);
    auVar58 = vbroadcastss_avx512vl(auVar39);
    auVar74 = ZEXT1632(auVar39);
    auVar59 = vpermps_avx512vl(auVar67,auVar74);
    auVar60 = vbroadcastss_avx512vl(auVar45);
    auVar68 = ZEXT1632(auVar45);
    auVar61 = vpermps_avx512vl(auVar67,auVar68);
    auVar62 = vbroadcastss_avx512vl(auVar36);
    auVar70 = ZEXT1632(auVar36);
    auVar63 = vpermps_avx512vl(auVar67,auVar70);
    auVar78._4_4_ = fVar215;
    auVar78._0_4_ = fVar215;
    auVar78._8_4_ = fVar215;
    auVar78._12_4_ = fVar215;
    auVar78._16_4_ = fVar215;
    auVar78._20_4_ = fVar215;
    auVar78._24_4_ = fVar215;
    auVar78._28_4_ = fVar215;
    auVar69._8_4_ = 2;
    auVar69._0_8_ = 0x200000002;
    auVar69._12_4_ = 2;
    auVar69._16_4_ = 2;
    auVar69._20_4_ = 2;
    auVar69._24_4_ = 2;
    auVar69._28_4_ = 2;
    auVar64 = vpermps_avx512vl(auVar69,auVar73);
    auVar65 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar66 = vpermps_avx512vl(auVar65,auVar73);
    auVar73 = vpermps_avx2(auVar69,auVar74);
    auVar67 = vpermps_avx512vl(auVar65,auVar74);
    auVar74 = vpermps_avx2(auVar69,auVar68);
    auVar68 = vpermps_avx512vl(auVar65,auVar68);
    auVar69 = vpermps_avx512vl(auVar69,auVar70);
    auVar65 = vpermps_avx512vl(auVar65,auVar70);
    auVar38 = vfmadd132ps_fma(auVar75,auVar71,_DAT_02020f20);
    auVar75 = vsubps_avx(auVar136,ZEXT1632(auVar38));
    auVar70 = vmulps_avx512vl(auVar58,ZEXT1632(auVar38));
    auVar76 = ZEXT1632(auVar38);
    auVar71 = vmulps_avx512vl(auVar59,auVar76);
    auVar36 = vfmadd231ps_fma(auVar70,auVar75,auVar77);
    auVar37 = vfmadd231ps_fma(auVar71,auVar75,auVar72);
    auVar70 = vmulps_avx512vl(auVar60,auVar76);
    auVar71 = vmulps_avx512vl(auVar61,auVar76);
    auVar58 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar58);
    auVar70 = vfmadd231ps_avx512vl(auVar71,auVar75,auVar59);
    auVar59 = vmulps_avx512vl(auVar62,auVar76);
    auVar77 = ZEXT1632(auVar38);
    auVar63 = vmulps_avx512vl(auVar63,auVar77);
    auVar71 = vfmadd231ps_avx512vl(auVar59,auVar75,auVar60);
    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar75,auVar61);
    fVar211 = auVar38._0_4_;
    fVar212 = auVar38._4_4_;
    auVar59._4_4_ = fVar212 * auVar58._4_4_;
    auVar59._0_4_ = fVar211 * auVar58._0_4_;
    fVar213 = auVar38._8_4_;
    auVar59._8_4_ = fVar213 * auVar58._8_4_;
    fVar214 = auVar38._12_4_;
    auVar59._12_4_ = fVar214 * auVar58._12_4_;
    auVar59._16_4_ = auVar58._16_4_ * 0.0;
    auVar59._20_4_ = auVar58._20_4_ * 0.0;
    auVar59._24_4_ = auVar58._24_4_ * 0.0;
    auVar59._28_4_ = fVar200;
    auVar60._4_4_ = fVar212 * auVar70._4_4_;
    auVar60._0_4_ = fVar211 * auVar70._0_4_;
    auVar60._8_4_ = fVar213 * auVar70._8_4_;
    auVar60._12_4_ = fVar214 * auVar70._12_4_;
    auVar60._16_4_ = auVar70._16_4_ * 0.0;
    auVar60._20_4_ = auVar70._20_4_ * 0.0;
    auVar60._24_4_ = auVar70._24_4_ * 0.0;
    auVar60._28_4_ = auVar72._28_4_;
    auVar36 = vfmadd231ps_fma(auVar59,auVar75,ZEXT1632(auVar36));
    auVar37 = vfmadd231ps_fma(auVar60,auVar75,ZEXT1632(auVar37));
    auVar76._0_4_ = fVar211 * auVar71._0_4_;
    auVar76._4_4_ = fVar212 * auVar71._4_4_;
    auVar76._8_4_ = fVar213 * auVar71._8_4_;
    auVar76._12_4_ = fVar214 * auVar71._12_4_;
    auVar76._16_4_ = auVar71._16_4_ * 0.0;
    auVar76._20_4_ = auVar71._20_4_ * 0.0;
    auVar76._24_4_ = auVar71._24_4_ * 0.0;
    auVar76._28_4_ = 0;
    auVar61._4_4_ = fVar212 * auVar63._4_4_;
    auVar61._0_4_ = fVar211 * auVar63._0_4_;
    auVar61._8_4_ = fVar213 * auVar63._8_4_;
    auVar61._12_4_ = fVar214 * auVar63._12_4_;
    auVar61._16_4_ = auVar63._16_4_ * 0.0;
    auVar61._20_4_ = auVar63._20_4_ * 0.0;
    auVar61._24_4_ = auVar63._24_4_ * 0.0;
    auVar61._28_4_ = auVar71._28_4_;
    auVar39 = vfmadd231ps_fma(auVar76,auVar75,auVar58);
    auVar45 = vfmadd231ps_fma(auVar61,auVar75,auVar70);
    auVar63._28_4_ = auVar70._28_4_;
    auVar63._0_28_ =
         ZEXT1628(CONCAT412(fVar214 * auVar45._12_4_,
                            CONCAT48(fVar213 * auVar45._8_4_,
                                     CONCAT44(fVar212 * auVar45._4_4_,fVar211 * auVar45._0_4_))));
    auVar47 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar214 * auVar39._12_4_,
                                                 CONCAT48(fVar213 * auVar39._8_4_,
                                                          CONCAT44(fVar212 * auVar39._4_4_,
                                                                   fVar211 * auVar39._0_4_)))),
                              auVar75,ZEXT1632(auVar36));
    auVar52 = vfmadd231ps_fma(auVar63,auVar75,ZEXT1632(auVar37));
    auVar72 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar36));
    auVar58 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar37));
    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar72 = vmulps_avx512vl(auVar72,auVar59);
    auVar58 = vmulps_avx512vl(auVar58,auVar59);
    auVar70._0_4_ = fVar215 * auVar72._0_4_;
    auVar70._4_4_ = fVar215 * auVar72._4_4_;
    auVar70._8_4_ = fVar215 * auVar72._8_4_;
    auVar70._12_4_ = fVar215 * auVar72._12_4_;
    auVar70._16_4_ = fVar215 * auVar72._16_4_;
    auVar70._20_4_ = fVar215 * auVar72._20_4_;
    auVar70._24_4_ = fVar215 * auVar72._24_4_;
    auVar70._28_4_ = 0;
    auVar72 = vmulps_avx512vl(auVar78,auVar58);
    auVar39 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
    auVar58 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar60 = vpermt2ps_avx512vl(ZEXT1632(auVar52),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar111._0_4_ = auVar70._0_4_ + auVar47._0_4_;
    auVar111._4_4_ = auVar70._4_4_ + auVar47._4_4_;
    auVar111._8_4_ = auVar70._8_4_ + auVar47._8_4_;
    auVar111._12_4_ = auVar70._12_4_ + auVar47._12_4_;
    auVar111._16_4_ = auVar70._16_4_ + 0.0;
    auVar111._20_4_ = auVar70._20_4_ + 0.0;
    auVar111._24_4_ = auVar70._24_4_ + 0.0;
    auVar111._28_4_ = 0;
    auVar71 = ZEXT1632(auVar39);
    auVar61 = vpermt2ps_avx512vl(auVar70,_DAT_0205fd20,auVar71);
    auVar63 = vaddps_avx512vl(ZEXT1632(auVar52),auVar72);
    auVar62 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,auVar71);
    auVar72 = vsubps_avx(auVar58,auVar61);
    auVar61 = vsubps_avx512vl(auVar60,auVar62);
    auVar62 = vmulps_avx512vl(auVar73,auVar77);
    auVar70 = vmulps_avx512vl(auVar67,auVar77);
    auVar62 = vfmadd231ps_avx512vl(auVar62,auVar75,auVar64);
    auVar64 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar66);
    auVar66 = vmulps_avx512vl(auVar74,auVar77);
    auVar70 = vmulps_avx512vl(auVar68,auVar77);
    auVar73 = vfmadd231ps_avx512vl(auVar66,auVar75,auVar73);
    auVar66 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar67);
    auVar67 = vmulps_avx512vl(auVar69,auVar77);
    auVar65 = vmulps_avx512vl(auVar65,auVar77);
    auVar36 = vfmadd231ps_fma(auVar67,auVar75,auVar74);
    auVar37 = vfmadd231ps_fma(auVar65,auVar75,auVar68);
    auVar65 = vmulps_avx512vl(auVar77,auVar73);
    auVar67 = vmulps_avx512vl(ZEXT1632(auVar38),auVar66);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar75,auVar62);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar75,auVar64);
    auVar73 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar214 * auVar36._12_4_,
                                            CONCAT48(fVar213 * auVar36._8_4_,
                                                     CONCAT44(fVar212 * auVar36._4_4_,
                                                              fVar211 * auVar36._0_4_)))),auVar75,
                         auVar73);
    auVar66 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar214 * auVar37._12_4_,
                                            CONCAT48(fVar213 * auVar37._8_4_,
                                                     CONCAT44(fVar212 * auVar37._4_4_,
                                                              fVar211 * auVar37._0_4_)))),auVar75,
                         auVar66);
    auVar62._4_4_ = fVar212 * auVar73._4_4_;
    auVar62._0_4_ = fVar211 * auVar73._0_4_;
    auVar62._8_4_ = fVar213 * auVar73._8_4_;
    auVar62._12_4_ = fVar214 * auVar73._12_4_;
    auVar62._16_4_ = auVar73._16_4_ * 0.0;
    auVar62._20_4_ = auVar73._20_4_ * 0.0;
    auVar62._24_4_ = auVar73._24_4_ * 0.0;
    auVar62._28_4_ = auVar68._28_4_;
    auVar64._4_4_ = fVar212 * auVar66._4_4_;
    auVar64._0_4_ = fVar211 * auVar66._0_4_;
    auVar64._8_4_ = fVar213 * auVar66._8_4_;
    auVar64._12_4_ = fVar214 * auVar66._12_4_;
    auVar64._16_4_ = auVar66._16_4_ * 0.0;
    auVar64._20_4_ = auVar66._20_4_ * 0.0;
    auVar64._24_4_ = auVar66._24_4_ * 0.0;
    auVar64._28_4_ = auVar74._28_4_;
    auVar74 = vfmadd231ps_avx512vl(auVar62,auVar75,auVar65);
    auVar62 = vfmadd231ps_avx512vl(auVar64,auVar67,auVar75);
    auVar75 = vsubps_avx512vl(auVar73,auVar65);
    auVar73 = vsubps_avx512vl(auVar66,auVar67);
    auVar75 = vmulps_avx512vl(auVar75,auVar59);
    auVar73 = vmulps_avx512vl(auVar73,auVar59);
    fVar200 = fVar215 * auVar75._0_4_;
    fVar211 = fVar215 * auVar75._4_4_;
    auVar65._4_4_ = fVar211;
    auVar65._0_4_ = fVar200;
    fVar212 = fVar215 * auVar75._8_4_;
    auVar65._8_4_ = fVar212;
    fVar213 = fVar215 * auVar75._12_4_;
    auVar65._12_4_ = fVar213;
    fVar214 = fVar215 * auVar75._16_4_;
    auVar65._16_4_ = fVar214;
    fVar216 = fVar215 * auVar75._20_4_;
    auVar65._20_4_ = fVar216;
    fVar215 = fVar215 * auVar75._24_4_;
    auVar65._24_4_ = fVar215;
    auVar65._28_4_ = auVar75._28_4_;
    auVar73 = vmulps_avx512vl(auVar78,auVar73);
    auVar59 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,auVar71);
    auVar64 = vpermt2ps_avx512vl(auVar62,_DAT_0205fd20,auVar71);
    auVar199._0_4_ = auVar74._0_4_ + fVar200;
    auVar199._4_4_ = auVar74._4_4_ + fVar211;
    auVar199._8_4_ = auVar74._8_4_ + fVar212;
    auVar199._12_4_ = auVar74._12_4_ + fVar213;
    auVar199._16_4_ = auVar74._16_4_ + fVar214;
    auVar199._20_4_ = auVar74._20_4_ + fVar216;
    auVar199._24_4_ = auVar74._24_4_ + fVar215;
    auVar199._28_4_ = auVar74._28_4_ + auVar75._28_4_;
    auVar75 = vpermt2ps_avx512vl(auVar65,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar65 = vaddps_avx512vl(auVar62,auVar73);
    auVar73 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar75 = vsubps_avx(auVar59,auVar75);
    auVar73 = vsubps_avx512vl(auVar64,auVar73);
    auVar136 = ZEXT1632(auVar47);
    auVar66 = vsubps_avx512vl(auVar74,auVar136);
    auVar81 = ZEXT1632(auVar52);
    auVar67 = vsubps_avx512vl(auVar62,auVar81);
    auVar68 = vsubps_avx512vl(auVar59,auVar58);
    auVar66 = vaddps_avx512vl(auVar66,auVar68);
    auVar68 = vsubps_avx512vl(auVar64,auVar60);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar81,auVar66);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar136,auVar67);
    auVar69 = vmulps_avx512vl(auVar63,auVar66);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar111,auVar67);
    auVar70 = vmulps_avx512vl(auVar61,auVar66);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar72,auVar67);
    auVar71 = vmulps_avx512vl(auVar60,auVar66);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar58,auVar67);
    auVar76 = vmulps_avx512vl(auVar62,auVar66);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar74,auVar67);
    auVar77 = vmulps_avx512vl(auVar65,auVar66);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar199,auVar67);
    auVar78 = vmulps_avx512vl(auVar73,auVar66);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar75,auVar67);
    auVar66 = vmulps_avx512vl(auVar64,auVar66);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar59,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar69);
    auVar68 = vmaxps_avx512vl(auVar68,auVar69);
    auVar69 = vminps_avx512vl(auVar70,auVar71);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar69 = vmaxps_avx512vl(auVar70,auVar71);
    auVar68 = vmaxps_avx512vl(auVar68,auVar69);
    auVar69 = vminps_avx512vl(auVar76,auVar77);
    auVar70 = vmaxps_avx512vl(auVar76,auVar77);
    auVar71 = vminps_avx512vl(auVar78,auVar66);
    auVar69 = vminps_avx512vl(auVar69,auVar71);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar66 = vmaxps_avx512vl(auVar78,auVar66);
    auVar66 = vmaxps_avx512vl(auVar70,auVar66);
    auVar66 = vmaxps_avx512vl(auVar68,auVar66);
    uVar9 = vcmpps_avx512vl(auVar67,local_1c0,2);
    uVar10 = vcmpps_avx512vl(auVar66,local_1e0,5);
    uVar24 = 0;
    bVar18 = (byte)uVar9 & (byte)uVar10 & 0x7f;
    if (bVar18 != 0) {
      auVar66 = vsubps_avx512vl(auVar58,auVar136);
      auVar67 = vsubps_avx512vl(auVar60,auVar81);
      auVar68 = vsubps_avx512vl(auVar59,auVar74);
      auVar66 = vaddps_avx512vl(auVar66,auVar68);
      auVar68 = vsubps_avx512vl(auVar64,auVar62);
      auVar67 = vaddps_avx512vl(auVar67,auVar68);
      auVar68 = vmulps_avx512vl(auVar81,auVar66);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar136);
      auVar63 = vmulps_avx512vl(auVar63,auVar66);
      auVar63 = vfnmadd213ps_avx512vl(auVar111,auVar67,auVar63);
      auVar61 = vmulps_avx512vl(auVar61,auVar66);
      auVar61 = vfnmadd213ps_avx512vl(auVar72,auVar67,auVar61);
      auVar72 = vmulps_avx512vl(auVar60,auVar66);
      auVar60 = vfnmadd231ps_avx512vl(auVar72,auVar67,auVar58);
      auVar72 = vmulps_avx512vl(auVar62,auVar66);
      auVar74 = vfnmadd231ps_avx512vl(auVar72,auVar67,auVar74);
      auVar72 = vmulps_avx512vl(auVar65,auVar66);
      auVar62 = vfnmadd213ps_avx512vl(auVar199,auVar67,auVar72);
      auVar72 = vmulps_avx512vl(auVar73,auVar66);
      auVar65 = vfnmadd213ps_avx512vl(auVar75,auVar67,auVar72);
      auVar75 = vmulps_avx512vl(auVar64,auVar66);
      auVar59 = vfnmadd231ps_avx512vl(auVar75,auVar59,auVar67);
      auVar72 = vminps_avx(auVar68,auVar63);
      auVar75 = vmaxps_avx(auVar68,auVar63);
      auVar58 = vminps_avx(auVar61,auVar60);
      auVar58 = vminps_avx(auVar72,auVar58);
      auVar72 = vmaxps_avx(auVar61,auVar60);
      auVar75 = vmaxps_avx(auVar75,auVar72);
      auVar73 = vminps_avx(auVar74,auVar62);
      auVar72 = vmaxps_avx(auVar74,auVar62);
      auVar74 = vminps_avx(auVar65,auVar59);
      auVar73 = vminps_avx(auVar73,auVar74);
      auVar73 = vminps_avx(auVar58,auVar73);
      auVar58 = vmaxps_avx(auVar65,auVar59);
      auVar72 = vmaxps_avx(auVar72,auVar58);
      auVar75 = vmaxps_avx(auVar75,auVar72);
      uVar9 = vcmpps_avx512vl(auVar75,local_1e0,5);
      uVar10 = vcmpps_avx512vl(auVar73,local_1c0,2);
      uVar24 = (uint)(bVar18 & (byte)uVar9 & (byte)uVar10);
    }
    if (uVar24 != 0) {
      auStack_420[uVar20] = uVar24;
      uVar9 = vmovlps_avx(auVar33);
      *(undefined8 *)(&uStack_260 + uVar20 * 2) = uVar9;
      uVar25 = vmovlps_avx512f(auVar54);
      auStack_1a0[uVar20] = uVar25;
      uVar20 = (ulong)((int)uVar20 + 1);
    }
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar249 = ZEXT1664(auVar33);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM18 = ZEXT3264(auVar75);
    auVar250 = ZEXT464(0x3f800000);
    auVar79._16_16_ = auVar75._16_16_;
    auVar75 = auVar79;
    do {
      auVar38 = auVar254._0_16_;
      auVar33 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar20 == 0) {
        if (bVar27) {
          return local_5a1;
        }
        uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar15._4_4_ = uVar99;
        auVar15._0_4_ = uVar99;
        auVar15._8_4_ = uVar99;
        auVar15._12_4_ = uVar99;
        uVar9 = vcmpps_avx512vl(local_380,auVar15,2);
        uVar26 = (uint)uVar29 & (uint)uVar9;
        uVar29 = (ulong)uVar26;
        local_5a1 = uVar26 != 0;
        if (!local_5a1) {
          return local_5a1;
        }
        goto LAB_01b78d03;
      }
      uVar19 = (int)uVar20 - 1;
      uVar21 = (ulong)uVar19;
      uVar24 = (&uStack_260)[uVar21 * 2];
      fVar215 = afStack_25c[uVar21 * 2];
      uVar4 = auStack_420[uVar21];
      auVar229._8_8_ = 0;
      auVar229._0_8_ = auStack_1a0[uVar21];
      auVar236 = ZEXT1664(auVar229);
      lVar23 = 0;
      for (uVar25 = (ulong)uVar4; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar22 = uVar4 - 1 & uVar4;
      auStack_420[uVar21] = uVar22;
      if (uVar22 == 0) {
        uVar20 = (ulong)uVar19;
      }
      auVar115._0_4_ = (float)lVar23;
      auVar115._4_8_ = SUB128(ZEXT812(0),4);
      auVar115._12_4_ = 0;
      auVar37 = vmulss_avx512f(auVar115,SUB6416(ZEXT464(0x3e124925),0));
      lVar23 = lVar23 + 1;
      auVar36 = vcvtsi2ss_avx512f(auVar38,lVar23);
      auVar36 = vmulss_avx512f(auVar36,SUB6416(ZEXT464(0x3e124925),0));
      auVar45 = auVar250._0_16_;
      auVar39 = vsubss_avx512f(auVar45,auVar37);
      auVar37 = vmulss_avx512f(ZEXT416((uint)fVar215),auVar37);
      auVar68._0_16_ = vfmadd231ss_avx512f(auVar37,ZEXT416(uVar24),auVar39);
      auVar37 = vsubss_avx512f(auVar45,auVar36);
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar36._0_4_)),ZEXT416(uVar24),auVar37);
      auVar37 = vsubss_avx512f(auVar36,auVar68._0_16_);
      vucomiss_avx512f(auVar37);
      if (uVar4 == 0 || lVar23 == 0) break;
      auVar39 = vshufps_avx(auVar229,auVar229,0x50);
      vucomiss_avx512f(auVar37);
      uVar24 = (uint)uVar20;
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = &DAT_3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar47 = vsubps_avx(auVar116,auVar39);
      fVar215 = auVar39._0_4_;
      auVar131._0_4_ = fVar123 * fVar215;
      fVar200 = auVar39._4_4_;
      auVar131._4_4_ = fVar124 * fVar200;
      fVar211 = auVar39._8_4_;
      auVar131._8_4_ = fVar123 * fVar211;
      fVar212 = auVar39._12_4_;
      auVar131._12_4_ = fVar124 * fVar212;
      auVar141._0_4_ = fVar139 * fVar215;
      auVar141._4_4_ = fVar146 * fVar200;
      auVar141._8_4_ = fVar139 * fVar211;
      auVar141._12_4_ = fVar146 * fVar212;
      auVar150._0_4_ = fVar224 * fVar215;
      auVar150._4_4_ = fVar225 * fVar200;
      auVar150._8_4_ = fVar224 * fVar211;
      auVar150._12_4_ = fVar225 * fVar212;
      auVar106._0_4_ = fVar226 * fVar215;
      auVar106._4_4_ = fVar227 * fVar200;
      auVar106._8_4_ = fVar226 * fVar211;
      auVar106._12_4_ = fVar227 * fVar212;
      auVar39 = vfmadd231ps_fma(auVar131,auVar47,auVar172);
      auVar52 = vfmadd231ps_fma(auVar141,auVar47,auVar34);
      auVar54 = vfmadd231ps_fma(auVar150,auVar47,auVar35);
      auVar46 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar47);
      auVar122._16_16_ = auVar39;
      auVar122._0_16_ = auVar39;
      auVar137._16_16_ = auVar52;
      auVar137._0_16_ = auVar52;
      auVar144._16_16_ = auVar54;
      auVar144._0_16_ = auVar54;
      auVar165._0_4_ = auVar68._0_4_;
      auVar165._4_4_ = auVar165._0_4_;
      auVar165._8_4_ = auVar165._0_4_;
      auVar165._12_4_ = auVar165._0_4_;
      uVar99 = auVar36._0_4_;
      auVar165._20_4_ = uVar99;
      auVar165._16_4_ = uVar99;
      auVar165._24_4_ = uVar99;
      auVar165._28_4_ = uVar99;
      auVar75 = vsubps_avx(auVar137,auVar122);
      auVar47 = vfmadd213ps_fma(auVar75,auVar165,auVar122);
      auVar75 = vsubps_avx(auVar144,auVar137);
      auVar52 = vfmadd213ps_fma(auVar75,auVar165,auVar137);
      auVar39 = vsubps_avx(auVar46,auVar54);
      auVar138._16_16_ = auVar39;
      auVar138._0_16_ = auVar39;
      auVar39 = vfmadd213ps_fma(auVar138,auVar165,auVar144);
      auVar75 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar47));
      auVar47 = vfmadd213ps_fma(auVar75,auVar165,ZEXT1632(auVar47));
      auVar75 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar52));
      auVar39 = vfmadd213ps_fma(auVar75,auVar165,ZEXT1632(auVar52));
      auVar75 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar47));
      auVar240 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar75,auVar165);
      auVar75 = vmulps_avx512vl(auVar75,in_ZMM18._0_32_);
      auVar81._16_16_ = auVar75._16_16_;
      auVar39 = vmulss_avx512f(auVar37,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar215 = auVar39._0_4_;
      auVar151._0_8_ =
           CONCAT44(auVar240._4_4_ + fVar215 * auVar75._4_4_,
                    auVar240._0_4_ + fVar215 * auVar75._0_4_);
      auVar151._8_4_ = auVar240._8_4_ + fVar215 * auVar75._8_4_;
      auVar151._12_4_ = auVar240._12_4_ + fVar215 * auVar75._12_4_;
      auVar132._0_4_ = fVar215 * auVar75._16_4_;
      auVar132._4_4_ = fVar215 * auVar75._20_4_;
      auVar132._8_4_ = fVar215 * auVar75._24_4_;
      auVar132._12_4_ = fVar215 * auVar75._28_4_;
      auVar51 = vsubps_avx((undefined1  [16])0x0,auVar132);
      auVar56 = vshufpd_avx(auVar240,auVar240,3);
      auVar53 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar39 = vsubps_avx(auVar56,auVar240);
      auVar47 = vsubps_avx(auVar53,(undefined1  [16])0x0);
      auVar173._0_4_ = auVar47._0_4_ + auVar39._0_4_;
      auVar173._4_4_ = auVar47._4_4_ + auVar39._4_4_;
      auVar173._8_4_ = auVar47._8_4_ + auVar39._8_4_;
      auVar173._12_4_ = auVar47._12_4_ + auVar39._12_4_;
      auVar39 = vshufps_avx(auVar240,auVar240,0xb1);
      auVar47 = vshufps_avx(auVar151,auVar151,0xb1);
      auVar52 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar230._4_4_ = auVar173._0_4_;
      auVar230._0_4_ = auVar173._0_4_;
      auVar230._8_4_ = auVar173._0_4_;
      auVar230._12_4_ = auVar173._0_4_;
      auVar46 = vshufps_avx(auVar173,auVar173,0x55);
      fVar215 = auVar46._0_4_;
      auVar185._0_4_ = auVar39._0_4_ * fVar215;
      fVar200 = auVar46._4_4_;
      auVar185._4_4_ = auVar39._4_4_ * fVar200;
      fVar211 = auVar46._8_4_;
      auVar185._8_4_ = auVar39._8_4_ * fVar211;
      fVar212 = auVar46._12_4_;
      auVar185._12_4_ = auVar39._12_4_ * fVar212;
      auVar196._0_4_ = auVar47._0_4_ * fVar215;
      auVar196._4_4_ = auVar47._4_4_ * fVar200;
      auVar196._8_4_ = auVar47._8_4_ * fVar211;
      auVar196._12_4_ = auVar47._12_4_ * fVar212;
      auVar203._0_4_ = auVar52._0_4_ * fVar215;
      auVar203._4_4_ = auVar52._4_4_ * fVar200;
      auVar203._8_4_ = auVar52._8_4_ * fVar211;
      auVar203._12_4_ = auVar52._12_4_ * fVar212;
      auVar174._0_4_ = auVar54._0_4_ * fVar215;
      auVar174._4_4_ = auVar54._4_4_ * fVar200;
      auVar174._8_4_ = auVar54._8_4_ * fVar211;
      auVar174._12_4_ = auVar54._12_4_ * fVar212;
      auVar39 = vfmadd231ps_fma(auVar185,auVar230,auVar240);
      auVar47 = vfmadd231ps_fma(auVar196,auVar230,auVar151);
      auVar46 = vfmadd231ps_fma(auVar203,auVar230,auVar51);
      auVar57 = vfmadd231ps_fma(auVar174,(undefined1  [16])0x0,auVar230);
      auVar55 = vshufpd_avx(auVar39,auVar39,1);
      auVar48 = vshufpd_avx(auVar47,auVar47,1);
      auVar49 = vshufpd_avx(auVar46,auVar46,1);
      auVar50 = vshufpd_avx(auVar57,auVar57,1);
      auVar52 = vminss_avx(auVar39,auVar47);
      auVar39 = vmaxss_avx(auVar47,auVar39);
      auVar54 = vminss_avx(auVar46,auVar57);
      auVar47 = vmaxss_avx(auVar57,auVar46);
      auVar54 = vminss_avx(auVar52,auVar54);
      auVar39 = vmaxss_avx(auVar47,auVar39);
      auVar46 = vminss_avx(auVar55,auVar48);
      auVar47 = vmaxss_avx(auVar48,auVar55);
      auVar55 = vminss_avx(auVar49,auVar50);
      auVar52 = vmaxss_avx(auVar50,auVar49);
      auVar46 = vminss_avx(auVar46,auVar55);
      auVar47 = vmaxss_avx(auVar52,auVar47);
      vucomiss_avx512f(auVar54);
      if ((uVar24 < 5) || (auVar47 = vucomiss_avx512f(auVar33), uVar24 < 5)) {
        auVar39 = vucomiss_avx512f(auVar33);
        uVar9 = vcmpps_avx512vl(auVar46,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar10 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar24 & ((byte)uVar10 | (byte)uVar9)) != 0) goto LAB_01b79c42;
        uVar9 = vcmpps_avx512vl(auVar33,auVar47,5);
        uVar10 = vcmpps_avx512vl(auVar46,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar10 | (ushort)uVar9) & 1) == 0) goto LAB_01b79c42;
LAB_01b7a9e5:
        bVar11 = true;
        auVar236 = ZEXT1664(auVar229);
        auVar68._16_16_ = auVar81._16_16_;
        auVar75 = auVar68;
      }
      else {
LAB_01b79c42:
        auVar55 = auVar253._0_16_;
        uVar9 = vcmpss_avx512f(auVar54,auVar55,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        iVar93 = auVar250._0_4_;
        fVar215 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar93);
        uVar9 = vcmpss_avx512f(auVar39,auVar55,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar200 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar93);
        bVar11 = fVar215 != fVar200;
        iVar252 = auVar253._0_4_;
        auVar81._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar80._4_28_ = auVar81._4_28_;
        auVar80._0_4_ = (uint)bVar11 * iVar252 + (uint)!bVar11 * 0x7f800000;
        auVar52 = auVar80._0_16_;
        auVar83._16_16_ = auVar81._16_16_;
        auVar83._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar82._4_28_ = auVar83._4_28_;
        auVar82._0_4_ = (uint)bVar11 * iVar252 + (uint)!bVar11 * -0x800000;
        auVar33 = auVar82._0_16_;
        uVar9 = vcmpss_avx512f(auVar46,auVar55,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar211 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar93);
        if ((fVar215 != fVar211) || (NAN(fVar215) || NAN(fVar211))) {
          fVar212 = auVar46._0_4_;
          fVar215 = auVar54._0_4_;
          bVar11 = fVar212 == fVar215;
          if ((!bVar11) || (NAN(fVar212) || NAN(fVar215))) {
            auVar14._8_4_ = 0x80000000;
            auVar14._0_8_ = 0x8000000080000000;
            auVar14._12_4_ = 0x80000000;
            auVar54 = vxorps_avx512vl(auVar54,auVar14);
            auVar245._0_4_ = auVar54._0_4_ / (fVar212 - fVar215);
            auVar245._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar45,auVar245);
            auVar46 = vfmadd213ss_avx512f(auVar54,auVar55,auVar245);
            auVar54 = auVar46;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar85._16_16_ = auVar81._16_16_;
            auVar85._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar84._4_28_ = auVar85._4_28_;
            auVar84._0_4_ = (uint)bVar11 * iVar252 + (uint)!bVar11 * 0x7f800000;
            auVar46 = auVar84._0_16_;
            auVar54 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar52 = vminss_avx(auVar52,auVar46);
          auVar33 = vmaxss_avx(auVar54,auVar33);
        }
        uVar9 = vcmpss_avx512f(auVar47,auVar55,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar215 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar93);
        if ((fVar200 != fVar215) || (NAN(fVar200) || NAN(fVar215))) {
          fVar212 = auVar47._0_4_;
          fVar200 = auVar39._0_4_;
          bVar11 = fVar212 == fVar200;
          if ((!bVar11) || (NAN(fVar212) || NAN(fVar200))) {
            auVar13._8_4_ = 0x80000000;
            auVar13._0_8_ = 0x8000000080000000;
            auVar13._12_4_ = 0x80000000;
            auVar39 = vxorps_avx512vl(auVar39,auVar13);
            auVar204._0_4_ = auVar39._0_4_ / (fVar212 - fVar200);
            auVar204._4_12_ = auVar39._4_12_;
            auVar39 = vsubss_avx512f(auVar45,auVar204);
            auVar47 = vfmadd213ss_avx512f(auVar39,auVar55,auVar204);
            auVar39 = auVar47;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar87._16_16_ = auVar81._16_16_;
            auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar86._4_28_ = auVar87._4_28_;
            auVar86._0_4_ = (uint)bVar11 * iVar252 + (uint)!bVar11 * 0x7f800000;
            auVar47 = auVar86._0_16_;
            auVar39 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar52 = vminss_avx(auVar52,auVar47);
          auVar33 = vmaxss_avx(auVar39,auVar33);
        }
        bVar11 = fVar211 != fVar215;
        auVar39 = vminss_avx512f(auVar52,auVar45);
        auVar89._16_16_ = auVar81._16_16_;
        auVar89._0_16_ = auVar52;
        auVar88._4_28_ = auVar89._4_28_;
        auVar88._0_4_ = (uint)bVar11 * auVar39._0_4_ + (uint)!bVar11 * auVar52._0_4_;
        auVar39 = vmaxss_avx512f(auVar45,auVar33);
        auVar91._16_16_ = auVar81._16_16_;
        auVar91._0_16_ = auVar33;
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar11 * auVar39._0_4_ + (uint)!bVar11 * auVar33._0_4_;
        auVar33 = vmaxss_avx512f(auVar55,auVar88._0_16_);
        auVar39 = vminss_avx512f(auVar90._0_16_,auVar45);
        bVar11 = true;
        if (auVar39._0_4_ < auVar33._0_4_) goto LAB_01b7a9e5;
        auVar48 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar33._0_4_ + -0.1)));
        auVar49 = vminss_avx512f(ZEXT416((uint)(auVar39._0_4_ + 0.1)),auVar45);
        auVar107._0_8_ = auVar240._0_8_;
        auVar107._8_8_ = auVar107._0_8_;
        auVar197._8_8_ = auVar151._0_8_;
        auVar197._0_8_ = auVar151._0_8_;
        auVar205._8_8_ = auVar51._0_8_;
        auVar205._0_8_ = auVar51._0_8_;
        auVar33 = vshufpd_avx(auVar151,auVar151,3);
        auVar39 = vshufpd_avx(auVar51,auVar51,3);
        auVar47 = vshufps_avx(auVar48,auVar49,0);
        auVar231._8_4_ = 0x3f800000;
        auVar231._0_8_ = &DAT_3f8000003f800000;
        auVar231._12_4_ = 0x3f800000;
        auVar52 = vsubps_avx(auVar231,auVar47);
        fVar215 = auVar47._0_4_;
        auVar243._0_4_ = fVar215 * auVar56._0_4_;
        fVar200 = auVar47._4_4_;
        auVar243._4_4_ = fVar200 * auVar56._4_4_;
        fVar211 = auVar47._8_4_;
        auVar243._8_4_ = fVar211 * auVar56._8_4_;
        fVar212 = auVar47._12_4_;
        auVar243._12_4_ = fVar212 * auVar56._12_4_;
        auVar152._0_4_ = fVar215 * auVar33._0_4_;
        auVar152._4_4_ = fVar200 * auVar33._4_4_;
        auVar152._8_4_ = fVar211 * auVar33._8_4_;
        auVar152._12_4_ = fVar212 * auVar33._12_4_;
        auVar162._0_4_ = fVar215 * auVar39._0_4_;
        auVar162._4_4_ = fVar200 * auVar39._4_4_;
        auVar162._8_4_ = fVar211 * auVar39._8_4_;
        auVar162._12_4_ = fVar212 * auVar39._12_4_;
        auVar133._0_4_ = fVar215 * auVar53._0_4_;
        auVar133._4_4_ = fVar200 * auVar53._4_4_;
        auVar133._8_4_ = fVar211 * auVar53._8_4_;
        auVar133._12_4_ = fVar212 * auVar53._12_4_;
        auVar54 = vfmadd231ps_fma(auVar243,auVar52,auVar107);
        auVar46 = vfmadd231ps_fma(auVar152,auVar52,auVar197);
        auVar55 = vfmadd231ps_fma(auVar162,auVar52,auVar205);
        auVar56 = vfmadd231ps_fma(auVar133,auVar52,ZEXT816(0));
        auVar33 = vsubss_avx512f(auVar45,auVar48);
        auVar39 = vmovshdup_avx512vl(auVar229);
        auVar50 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar39._0_4_ * auVar48._0_4_)),auVar229,
                                      auVar33);
        auVar33 = vsubss_avx512f(auVar45,auVar49);
        auVar51 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar49._0_4_ * auVar39._0_4_)),auVar229,
                                      auVar33);
        auVar52 = vdivss_avx512f(auVar45,auVar37);
        auVar33 = vsubps_avx(auVar46,auVar54);
        auVar117._0_4_ = auVar33._0_4_ * 3.0;
        auVar117._4_4_ = auVar33._4_4_ * 3.0;
        auVar117._8_4_ = auVar33._8_4_ * 3.0;
        auVar117._12_4_ = auVar33._12_4_ * 3.0;
        auVar33 = vsubps_avx(auVar55,auVar46);
        auVar175._0_4_ = auVar33._0_4_ * 3.0;
        auVar175._4_4_ = auVar33._4_4_ * 3.0;
        auVar175._8_4_ = auVar33._8_4_ * 3.0;
        auVar175._12_4_ = auVar33._12_4_ * 3.0;
        auVar33 = vsubps_avx(auVar56,auVar55);
        auVar186._0_4_ = auVar33._0_4_ * 3.0;
        auVar186._4_4_ = auVar33._4_4_ * 3.0;
        auVar186._8_4_ = auVar33._8_4_ * 3.0;
        auVar186._12_4_ = auVar33._12_4_ * 3.0;
        auVar37 = vminps_avx(auVar175,auVar186);
        auVar33 = vmaxps_avx(auVar175,auVar186);
        auVar37 = vminps_avx(auVar117,auVar37);
        auVar33 = vmaxps_avx(auVar117,auVar33);
        auVar39 = vshufpd_avx(auVar37,auVar37,3);
        auVar47 = vshufpd_avx(auVar33,auVar33,3);
        auVar37 = vminps_avx(auVar37,auVar39);
        auVar33 = vmaxps_avx(auVar33,auVar47);
        fVar215 = auVar52._0_4_;
        auVar187._0_4_ = fVar215 * auVar37._0_4_;
        auVar187._4_4_ = fVar215 * auVar37._4_4_;
        auVar187._8_4_ = fVar215 * auVar37._8_4_;
        auVar187._12_4_ = fVar215 * auVar37._12_4_;
        auVar176._0_4_ = fVar215 * auVar33._0_4_;
        auVar176._4_4_ = fVar215 * auVar33._4_4_;
        auVar176._8_4_ = fVar215 * auVar33._8_4_;
        auVar176._12_4_ = fVar215 * auVar33._12_4_;
        auVar53 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar51._0_4_ - auVar50._0_4_)));
        auVar33 = vshufpd_avx(auVar54,auVar54,3);
        auVar37 = vshufpd_avx(auVar46,auVar46,3);
        auVar39 = vshufpd_avx(auVar55,auVar55,3);
        auVar47 = vshufpd_avx(auVar56,auVar56,3);
        auVar33 = vsubps_avx(auVar33,auVar54);
        auVar52 = vsubps_avx(auVar37,auVar46);
        auVar54 = vsubps_avx(auVar39,auVar55);
        auVar47 = vsubps_avx(auVar47,auVar56);
        auVar37 = vminps_avx(auVar33,auVar52);
        auVar33 = vmaxps_avx(auVar33,auVar52);
        auVar39 = vminps_avx(auVar54,auVar47);
        auVar39 = vminps_avx(auVar37,auVar39);
        auVar37 = vmaxps_avx(auVar54,auVar47);
        auVar33 = vmaxps_avx(auVar33,auVar37);
        fVar215 = auVar53._0_4_;
        auVar206._0_4_ = fVar215 * auVar39._0_4_;
        auVar206._4_4_ = fVar215 * auVar39._4_4_;
        auVar206._8_4_ = fVar215 * auVar39._8_4_;
        auVar206._12_4_ = fVar215 * auVar39._12_4_;
        auVar218._0_4_ = fVar215 * auVar33._0_4_;
        auVar218._4_4_ = fVar215 * auVar33._4_4_;
        auVar218._8_4_ = fVar215 * auVar33._8_4_;
        auVar218._12_4_ = fVar215 * auVar33._12_4_;
        auVar49 = vinsertps_avx512f(auVar68._0_16_,auVar50,0x10);
        auVar47 = vinsertps_avx(auVar36,auVar51,0x10);
        auVar97._0_4_ = auVar49._0_4_ + auVar47._0_4_;
        auVar97._4_4_ = auVar49._4_4_ + auVar47._4_4_;
        auVar97._8_4_ = auVar49._8_4_ + auVar47._8_4_;
        auVar97._12_4_ = auVar49._12_4_ + auVar47._12_4_;
        auVar53 = vmulps_avx512vl(auVar97,auVar249._0_16_);
        auVar37 = vshufps_avx(auVar53,auVar53,0x54);
        uVar99 = auVar53._0_4_;
        auVar118._4_4_ = uVar99;
        auVar118._0_4_ = uVar99;
        auVar118._8_4_ = uVar99;
        auVar118._12_4_ = uVar99;
        auVar54 = vfmadd213ps_avx512vl(auVar44,auVar118,auVar30);
        auVar39 = vfmadd213ps_fma(auVar79._0_16_,auVar118,auVar31);
        auVar52 = vfmadd213ps_fma(local_270,auVar118,auVar43);
        auVar33 = vsubps_avx(auVar39,auVar54);
        auVar54 = vfmadd213ps_fma(auVar33,auVar118,auVar54);
        auVar33 = vsubps_avx(auVar52,auVar39);
        auVar33 = vfmadd213ps_fma(auVar33,auVar118,auVar39);
        auVar33 = vsubps_avx(auVar33,auVar54);
        auVar39 = vfmadd231ps_fma(auVar54,auVar33,auVar118);
        auVar119._0_8_ = CONCAT44(auVar33._4_4_ * 3.0,auVar33._0_4_ * 3.0);
        auVar119._8_4_ = auVar33._8_4_ * 3.0;
        auVar119._12_4_ = auVar33._12_4_ * 3.0;
        auVar232._8_8_ = auVar39._0_8_;
        auVar232._0_8_ = auVar39._0_8_;
        auVar33 = vshufpd_avx(auVar39,auVar39,3);
        auVar39 = vshufps_avx(auVar53,auVar53,0x55);
        auVar52 = vsubps_avx(auVar33,auVar232);
        auVar54 = vfmadd231ps_fma(auVar232,auVar39,auVar52);
        auVar246._8_8_ = auVar119._0_8_;
        auVar246._0_8_ = auVar119._0_8_;
        auVar33 = vshufpd_avx(auVar119,auVar119,3);
        auVar33 = vsubps_avx(auVar33,auVar246);
        auVar39 = vfmadd213ps_fma(auVar33,auVar39,auVar246);
        auVar46 = vxorps_avx512vl(auVar52,auVar38);
        auVar33 = vmovshdup_avx(auVar39);
        auVar38 = vxorps_avx512vl(auVar33,auVar38);
        auVar55 = vmovshdup_avx512vl(auVar52);
        auVar38 = vpermt2ps_avx512vl(auVar38,ZEXT416(5),auVar52);
        auVar33 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar33._0_4_ * auVar52._0_4_)),auVar39,auVar55
                                     );
        auVar39 = vpermt2ps_avx512vl(auVar39,SUB6416(ZEXT464(4),0),auVar46);
        auVar134._0_4_ = auVar33._0_4_;
        auVar134._4_4_ = auVar134._0_4_;
        auVar134._8_4_ = auVar134._0_4_;
        auVar134._12_4_ = auVar134._0_4_;
        auVar33 = vdivps_avx(auVar38,auVar134);
        auVar38 = vdivps_avx(auVar39,auVar134);
        fVar200 = auVar54._0_4_;
        auVar39 = vshufps_avx(auVar54,auVar54,0x55);
        fVar215 = auVar38._0_4_;
        auVar233._0_4_ = fVar200 * auVar33._0_4_ + auVar39._0_4_ * fVar215;
        auVar233._4_4_ = fVar200 * auVar33._4_4_ + auVar39._4_4_ * auVar38._4_4_;
        auVar233._8_4_ = fVar200 * auVar33._8_4_ + auVar39._8_4_ * auVar38._8_4_;
        auVar233._12_4_ = fVar200 * auVar33._12_4_ + auVar39._12_4_ * auVar38._12_4_;
        auVar48 = vsubps_avx(auVar37,auVar233);
        auVar52 = vmovshdup_avx(auVar33);
        auVar37 = vinsertps_avx(auVar187,auVar206,0x1c);
        auVar247._0_4_ = auVar52._0_4_ * auVar37._0_4_;
        auVar247._4_4_ = auVar52._4_4_ * auVar37._4_4_;
        auVar247._8_4_ = auVar52._8_4_ * auVar37._8_4_;
        auVar247._12_4_ = auVar52._12_4_ * auVar37._12_4_;
        auVar39 = vinsertps_avx(auVar176,auVar218,0x1c);
        auVar234._0_4_ = auVar52._0_4_ * auVar39._0_4_;
        auVar234._4_4_ = auVar52._4_4_ * auVar39._4_4_;
        auVar234._8_4_ = auVar52._8_4_ * auVar39._8_4_;
        auVar234._12_4_ = auVar52._12_4_ * auVar39._12_4_;
        auVar56 = vminps_avx512vl(auVar247,auVar234);
        auVar46 = vmaxps_avx(auVar234,auVar247);
        auVar55 = vmovshdup_avx(auVar38);
        auVar52 = vinsertps_avx(auVar206,auVar187,0x4c);
        auVar207._0_4_ = auVar55._0_4_ * auVar52._0_4_;
        auVar207._4_4_ = auVar55._4_4_ * auVar52._4_4_;
        auVar207._8_4_ = auVar55._8_4_ * auVar52._8_4_;
        auVar207._12_4_ = auVar55._12_4_ * auVar52._12_4_;
        auVar54 = vinsertps_avx(auVar218,auVar176,0x4c);
        auVar219._0_4_ = auVar55._0_4_ * auVar54._0_4_;
        auVar219._4_4_ = auVar55._4_4_ * auVar54._4_4_;
        auVar219._8_4_ = auVar55._8_4_ * auVar54._8_4_;
        auVar219._12_4_ = auVar55._12_4_ * auVar54._12_4_;
        auVar55 = vminps_avx(auVar207,auVar219);
        auVar56 = vaddps_avx512vl(auVar56,auVar55);
        auVar55 = vmaxps_avx(auVar219,auVar207);
        auVar208._0_4_ = auVar46._0_4_ + auVar55._0_4_;
        auVar208._4_4_ = auVar46._4_4_ + auVar55._4_4_;
        auVar208._8_4_ = auVar46._8_4_ + auVar55._8_4_;
        auVar208._12_4_ = auVar46._12_4_ + auVar55._12_4_;
        auVar220._8_8_ = 0x3f80000000000000;
        auVar220._0_8_ = 0x3f80000000000000;
        auVar46 = vsubps_avx(auVar220,auVar208);
        auVar55 = vsubps_avx(auVar220,auVar56);
        auVar56 = vsubps_avx(auVar49,auVar53);
        auVar53 = vsubps_avx(auVar47,auVar53);
        fVar214 = auVar56._0_4_;
        auVar248._0_4_ = fVar214 * auVar46._0_4_;
        fVar216 = auVar56._4_4_;
        auVar248._4_4_ = fVar216 * auVar46._4_4_;
        fVar237 = auVar56._8_4_;
        auVar248._8_4_ = fVar237 * auVar46._8_4_;
        fVar238 = auVar56._12_4_;
        auVar248._12_4_ = fVar238 * auVar46._12_4_;
        auVar57 = vbroadcastss_avx512vl(auVar33);
        auVar37 = vmulps_avx512vl(auVar57,auVar37);
        auVar39 = vmulps_avx512vl(auVar57,auVar39);
        auVar57 = vminps_avx512vl(auVar37,auVar39);
        auVar37 = vmaxps_avx(auVar39,auVar37);
        auVar188._0_4_ = fVar215 * auVar52._0_4_;
        auVar188._4_4_ = fVar215 * auVar52._4_4_;
        auVar188._8_4_ = fVar215 * auVar52._8_4_;
        auVar188._12_4_ = fVar215 * auVar52._12_4_;
        auVar177._0_4_ = fVar215 * auVar54._0_4_;
        auVar177._4_4_ = fVar215 * auVar54._4_4_;
        auVar177._8_4_ = fVar215 * auVar54._8_4_;
        auVar177._12_4_ = fVar215 * auVar54._12_4_;
        auVar39 = vminps_avx(auVar188,auVar177);
        auVar52 = vaddps_avx512vl(auVar57,auVar39);
        auVar54 = vmulps_avx512vl(auVar56,auVar55);
        fVar200 = auVar53._0_4_;
        auVar209._0_4_ = fVar200 * auVar46._0_4_;
        fVar211 = auVar53._4_4_;
        auVar209._4_4_ = fVar211 * auVar46._4_4_;
        fVar212 = auVar53._8_4_;
        auVar209._8_4_ = fVar212 * auVar46._8_4_;
        fVar213 = auVar53._12_4_;
        auVar209._12_4_ = fVar213 * auVar46._12_4_;
        auVar221._0_4_ = fVar200 * auVar55._0_4_;
        auVar221._4_4_ = fVar211 * auVar55._4_4_;
        auVar221._8_4_ = fVar212 * auVar55._8_4_;
        auVar221._12_4_ = fVar213 * auVar55._12_4_;
        auVar39 = vmaxps_avx(auVar177,auVar188);
        auVar178._0_4_ = auVar37._0_4_ + auVar39._0_4_;
        auVar178._4_4_ = auVar37._4_4_ + auVar39._4_4_;
        auVar178._8_4_ = auVar37._8_4_ + auVar39._8_4_;
        auVar178._12_4_ = auVar37._12_4_ + auVar39._12_4_;
        auVar189._8_8_ = 0x3f800000;
        auVar189._0_8_ = 0x3f800000;
        auVar37 = vsubps_avx(auVar189,auVar178);
        auVar39 = vsubps_avx(auVar189,auVar52);
        auVar244._0_4_ = fVar214 * auVar37._0_4_;
        auVar244._4_4_ = fVar216 * auVar37._4_4_;
        auVar244._8_4_ = fVar237 * auVar37._8_4_;
        auVar244._12_4_ = fVar238 * auVar37._12_4_;
        auVar235._0_4_ = fVar214 * auVar39._0_4_;
        auVar235._4_4_ = fVar216 * auVar39._4_4_;
        auVar235._8_4_ = fVar237 * auVar39._8_4_;
        auVar235._12_4_ = fVar238 * auVar39._12_4_;
        auVar179._0_4_ = fVar200 * auVar37._0_4_;
        auVar179._4_4_ = fVar211 * auVar37._4_4_;
        auVar179._8_4_ = fVar212 * auVar37._8_4_;
        auVar179._12_4_ = fVar213 * auVar37._12_4_;
        auVar190._0_4_ = fVar200 * auVar39._0_4_;
        auVar190._4_4_ = fVar211 * auVar39._4_4_;
        auVar190._8_4_ = fVar212 * auVar39._8_4_;
        auVar190._12_4_ = fVar213 * auVar39._12_4_;
        auVar37 = vminps_avx(auVar244,auVar235);
        auVar39 = vminps_avx(auVar179,auVar190);
        auVar52 = vminps_avx(auVar37,auVar39);
        auVar37 = vmaxps_avx(auVar235,auVar244);
        auVar39 = vmaxps_avx(auVar190,auVar179);
        auVar39 = vmaxps_avx(auVar39,auVar37);
        auVar46 = vminps_avx512vl(auVar248,auVar54);
        auVar37 = vminps_avx(auVar209,auVar221);
        auVar37 = vminps_avx(auVar46,auVar37);
        auVar37 = vhaddps_avx(auVar52,auVar37);
        auVar54 = vmaxps_avx512vl(auVar54,auVar248);
        auVar52 = vmaxps_avx(auVar221,auVar209);
        auVar52 = vmaxps_avx(auVar52,auVar54);
        auVar39 = vhaddps_avx(auVar39,auVar52);
        auVar37 = vshufps_avx(auVar37,auVar37,0xe8);
        auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
        auVar180._0_4_ = auVar37._0_4_ + auVar48._0_4_;
        auVar180._4_4_ = auVar37._4_4_ + auVar48._4_4_;
        auVar180._8_4_ = auVar37._8_4_ + auVar48._8_4_;
        auVar180._12_4_ = auVar37._12_4_ + auVar48._12_4_;
        auVar191._0_4_ = auVar39._0_4_ + auVar48._0_4_;
        auVar191._4_4_ = auVar39._4_4_ + auVar48._4_4_;
        auVar191._8_4_ = auVar39._8_4_ + auVar48._8_4_;
        auVar191._12_4_ = auVar39._12_4_ + auVar48._12_4_;
        auVar37 = vmaxps_avx(auVar49,auVar180);
        auVar39 = vminps_avx(auVar191,auVar47);
        uVar25 = vcmpps_avx512vl(auVar39,auVar37,1);
        auVar37 = vinsertps_avx(auVar50,auVar51,0x10);
        auVar236 = ZEXT1664(auVar37);
        auVar39 = ZEXT416(5);
        if ((uVar25 & 3) == 0) {
          vucomiss_avx512f(auVar68._0_16_);
          auVar92._0_16_ = vxorps_avx512vl(auVar39,auVar39);
          auVar92._16_16_ = auVar81._16_16_;
          auVar253 = ZEXT1664(auVar92._0_16_);
          local_460 = auVar42._0_4_;
          fStack_45c = auVar42._4_4_;
          fStack_458 = auVar42._8_4_;
          fStack_454 = auVar42._12_4_;
          if (uVar24 < 4 && (uVar4 == 0 || lVar23 == 0)) {
            bVar11 = false;
            auVar75 = auVar92;
          }
          else {
            lVar23 = 200;
            auVar75 = auVar92;
            do {
              auVar39 = vsubss_avx512f(auVar45,auVar48);
              fVar212 = auVar39._0_4_;
              fVar200 = fVar212 * fVar212 * fVar212;
              fVar213 = auVar48._0_4_;
              fVar211 = fVar213 * 3.0 * fVar212 * fVar212;
              fVar212 = fVar212 * fVar213 * fVar213 * 3.0;
              auVar153._4_4_ = fVar200;
              auVar153._0_4_ = fVar200;
              auVar153._8_4_ = fVar200;
              auVar153._12_4_ = fVar200;
              auVar142._4_4_ = fVar211;
              auVar142._0_4_ = fVar211;
              auVar142._8_4_ = fVar211;
              auVar142._12_4_ = fVar211;
              auVar108._4_4_ = fVar212;
              auVar108._0_4_ = fVar212;
              auVar108._8_4_ = fVar212;
              auVar108._12_4_ = fVar212;
              fVar213 = fVar213 * fVar213 * fVar213;
              auVar163._0_4_ = local_460 * fVar213;
              auVar163._4_4_ = fStack_45c * fVar213;
              auVar163._8_4_ = fStack_458 * fVar213;
              auVar163._12_4_ = fStack_454 * fVar213;
              auVar39 = vfmadd231ps_fma(auVar163,auVar43,auVar108);
              auVar39 = vfmadd231ps_fma(auVar39,auVar31,auVar142);
              auVar39 = vfmadd231ps_fma(auVar39,auVar30,auVar153);
              auVar109._8_8_ = auVar39._0_8_;
              auVar109._0_8_ = auVar39._0_8_;
              auVar39 = vshufpd_avx(auVar39,auVar39,3);
              auVar47 = vshufps_avx(auVar48,auVar48,0x55);
              auVar39 = vsubps_avx(auVar39,auVar109);
              auVar47 = vfmadd213ps_fma(auVar39,auVar47,auVar109);
              fVar200 = auVar47._0_4_;
              auVar39 = vshufps_avx(auVar47,auVar47,0x55);
              auVar110._0_4_ = auVar33._0_4_ * fVar200 + fVar215 * auVar39._0_4_;
              auVar110._4_4_ = auVar33._4_4_ * fVar200 + auVar38._4_4_ * auVar39._4_4_;
              auVar110._8_4_ = auVar33._8_4_ * fVar200 + auVar38._8_4_ * auVar39._8_4_;
              auVar110._12_4_ = auVar33._12_4_ * fVar200 + auVar38._12_4_ * auVar39._12_4_;
              auVar48 = vsubps_avx(auVar48,auVar110);
              auVar39 = vandps_avx512vl(auVar47,auVar251._0_16_);
              auVar75._0_16_ = vprolq_avx512vl(auVar39,0x20);
              auVar39 = vmaxss_avx(auVar75._0_16_,auVar39);
              bVar28 = auVar39._0_4_ <= fVar98;
              if (auVar39._0_4_ < fVar98) {
                auVar33 = vucomiss_avx512f(auVar92._0_16_);
                if (bVar28) {
                  auVar38 = vucomiss_avx512f(auVar33);
                  auVar250 = ZEXT1664(auVar38);
                  auVar236 = ZEXT1664(auVar37);
                  if (bVar28) {
                    vmovshdup_avx(auVar33);
                    auVar38 = vucomiss_avx512f(auVar92._0_16_);
                    if (bVar28) {
                      auVar39 = vucomiss_avx512f(auVar38);
                      auVar250 = ZEXT1664(auVar39);
                      if (bVar28) {
                        auVar45 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar53 = vinsertps_avx(auVar45,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar45 = vdpps_avx(auVar53,local_280,0x7f);
                        auVar47 = vdpps_avx(auVar53,local_290,0x7f);
                        auVar52 = vdpps_avx(auVar53,local_2a0,0x7f);
                        auVar54 = vdpps_avx(auVar53,local_2b0,0x7f);
                        auVar46 = vdpps_avx(auVar53,local_2c0,0x7f);
                        auVar55 = vdpps_avx(auVar53,local_2d0,0x7f);
                        auVar56 = vdpps_avx(auVar53,local_2e0,0x7f);
                        auVar53 = vdpps_avx(auVar53,local_2f0,0x7f);
                        auVar48 = vsubss_avx512f(auVar39,auVar38);
                        fVar215 = auVar38._0_4_;
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar46._0_4_)),auVar48,
                                                  auVar45);
                        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar215)),auVar48,
                                                  auVar47);
                        auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar215)),auVar48,
                                                  auVar52);
                        auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar53._0_4_)),auVar48,
                                                  auVar54);
                        auVar75._0_16_ = vsubss_avx512f(auVar39,auVar33);
                        auVar164._0_4_ = auVar75._0_4_;
                        fVar215 = auVar164._0_4_ * auVar164._0_4_ * auVar164._0_4_;
                        local_120 = auVar33._0_4_;
                        fVar200 = local_120 * 3.0 * auVar164._0_4_ * auVar164._0_4_;
                        fVar211 = auVar164._0_4_ * local_120 * local_120 * 3.0;
                        fVar213 = local_120 * local_120 * local_120;
                        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar52._0_4_)),
                                                  ZEXT416((uint)fVar211),auVar47);
                        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar200),auVar45);
                        auVar38 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar215),auVar38);
                        fVar212 = auVar38._0_4_;
                        if ((fVar94 <= fVar212) &&
                           (fVar214 = *(float *)(ray + k * 4 + 0x100), fVar212 <= fVar214)) {
                          auVar38 = vshufps_avx(auVar33,auVar33,0x55);
                          auVar192._8_4_ = 0x3f800000;
                          auVar192._0_8_ = &DAT_3f8000003f800000;
                          auVar192._12_4_ = 0x3f800000;
                          auVar39 = vsubps_avx(auVar192,auVar38);
                          fVar216 = auVar38._0_4_;
                          auVar198._0_4_ = fVar216 * (float)local_310._0_4_;
                          fVar237 = auVar38._4_4_;
                          auVar198._4_4_ = fVar237 * (float)local_310._4_4_;
                          fVar238 = auVar38._8_4_;
                          auVar198._8_4_ = fVar238 * fStack_308;
                          fVar239 = auVar38._12_4_;
                          auVar198._12_4_ = fVar239 * fStack_304;
                          auVar210._0_4_ = fVar216 * (float)local_360._0_4_;
                          auVar210._4_4_ = fVar237 * (float)local_360._4_4_;
                          auVar210._8_4_ = fVar238 * fStack_358;
                          auVar210._12_4_ = fVar239 * fStack_354;
                          auVar222._0_4_ = fVar216 * (float)local_370._0_4_;
                          auVar222._4_4_ = fVar237 * (float)local_370._4_4_;
                          auVar222._8_4_ = fVar238 * fStack_368;
                          auVar222._12_4_ = fVar239 * fStack_364;
                          auVar181._0_4_ = fVar216 * (float)local_330._0_4_;
                          auVar181._4_4_ = fVar237 * (float)local_330._4_4_;
                          auVar181._8_4_ = fVar238 * fStack_328;
                          auVar181._12_4_ = fVar239 * fStack_324;
                          auVar38 = vfmadd231ps_fma(auVar198,auVar39,local_300);
                          auVar45 = vfmadd231ps_fma(auVar210,auVar39,local_340);
                          auVar47 = vfmadd231ps_fma(auVar222,auVar39,local_350);
                          auVar52 = vfmadd231ps_fma(auVar181,auVar39,local_320);
                          auVar38 = vsubps_avx(auVar45,auVar38);
                          auVar39 = vsubps_avx(auVar47,auVar45);
                          auVar45 = vsubps_avx(auVar52,auVar47);
                          auVar223._0_4_ = local_120 * auVar39._0_4_;
                          auVar223._4_4_ = local_120 * auVar39._4_4_;
                          auVar223._8_4_ = local_120 * auVar39._8_4_;
                          auVar223._12_4_ = local_120 * auVar39._12_4_;
                          auVar164._4_4_ = auVar164._0_4_;
                          auVar164._8_4_ = auVar164._0_4_;
                          auVar164._12_4_ = auVar164._0_4_;
                          auVar38 = vfmadd231ps_fma(auVar223,auVar164,auVar38);
                          auVar182._0_4_ = local_120 * auVar45._0_4_;
                          auVar182._4_4_ = local_120 * auVar45._4_4_;
                          auVar182._8_4_ = local_120 * auVar45._8_4_;
                          auVar182._12_4_ = local_120 * auVar45._12_4_;
                          auVar39 = vfmadd231ps_fma(auVar182,auVar164,auVar39);
                          auVar183._0_4_ = local_120 * auVar39._0_4_;
                          auVar183._4_4_ = local_120 * auVar39._4_4_;
                          auVar183._8_4_ = local_120 * auVar39._8_4_;
                          auVar183._12_4_ = local_120 * auVar39._12_4_;
                          auVar38 = vfmadd231ps_fma(auVar183,auVar164,auVar38);
                          auVar12._8_4_ = 0x40400000;
                          auVar12._0_8_ = 0x4040000040400000;
                          auVar12._12_4_ = 0x40400000;
                          auVar75._0_16_ = vmulps_avx512vl(auVar38,auVar12);
                          pGVar5 = (context->scene->geometries).items[uVar26].ptr;
                          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar28 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar28 = true,
                                  pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar154._0_4_ = fVar213 * (float)local_3c0._0_4_;
                            auVar154._4_4_ = fVar213 * (float)local_3c0._4_4_;
                            auVar154._8_4_ = fVar213 * fStack_3b8;
                            auVar154._12_4_ = fVar213 * fStack_3b4;
                            auVar143._4_4_ = fVar211;
                            auVar143._0_4_ = fVar211;
                            auVar143._8_4_ = fVar211;
                            auVar143._12_4_ = fVar211;
                            auVar38 = vfmadd132ps_fma(auVar143,auVar154,local_3b0);
                            auVar135._4_4_ = fVar200;
                            auVar135._0_4_ = fVar200;
                            auVar135._8_4_ = fVar200;
                            auVar135._12_4_ = fVar200;
                            auVar38 = vfmadd132ps_fma(auVar135,auVar38,local_3a0);
                            auVar120._4_4_ = fVar215;
                            auVar120._0_4_ = fVar215;
                            auVar120._8_4_ = fVar215;
                            auVar120._12_4_ = fVar215;
                            auVar45 = vfmadd132ps_fma(auVar120,auVar38,local_390);
                            auVar38 = vshufps_avx(auVar45,auVar45,0xc9);
                            auVar39 = vshufps_avx(auVar75._0_16_,auVar75._0_16_,0xc9);
                            auVar121._0_4_ = auVar45._0_4_ * auVar39._0_4_;
                            auVar121._4_4_ = auVar45._4_4_ * auVar39._4_4_;
                            auVar121._8_4_ = auVar45._8_4_ * auVar39._8_4_;
                            auVar121._12_4_ = auVar45._12_4_ * auVar39._12_4_;
                            auVar38 = vfmsub231ps_fma(auVar121,auVar75._0_16_,auVar38);
                            auVar145._8_4_ = 1;
                            auVar145._0_8_ = 0x100000001;
                            auVar145._12_4_ = 1;
                            auVar145._16_4_ = 1;
                            auVar145._20_4_ = 1;
                            auVar145._24_4_ = 1;
                            auVar145._28_4_ = 1;
                            local_100 = vpermps_avx2(auVar145,ZEXT1632(auVar33));
                            auVar72 = vpermps_avx2(auVar145,ZEXT1632(auVar38));
                            auVar155._8_4_ = 2;
                            auVar155._0_8_ = 0x200000002;
                            auVar155._12_4_ = 2;
                            auVar155._16_4_ = 2;
                            auVar155._20_4_ = 2;
                            auVar155._24_4_ = 2;
                            auVar155._28_4_ = 2;
                            local_160 = vpermps_avx2(auVar155,ZEXT1632(auVar38));
                            local_140 = auVar38._0_4_;
                            local_180[0] = (RTCHitN)auVar72[0];
                            local_180[1] = (RTCHitN)auVar72[1];
                            local_180[2] = (RTCHitN)auVar72[2];
                            local_180[3] = (RTCHitN)auVar72[3];
                            local_180[4] = (RTCHitN)auVar72[4];
                            local_180[5] = (RTCHitN)auVar72[5];
                            local_180[6] = (RTCHitN)auVar72[6];
                            local_180[7] = (RTCHitN)auVar72[7];
                            local_180[8] = (RTCHitN)auVar72[8];
                            local_180[9] = (RTCHitN)auVar72[9];
                            local_180[10] = (RTCHitN)auVar72[10];
                            local_180[0xb] = (RTCHitN)auVar72[0xb];
                            local_180[0xc] = (RTCHitN)auVar72[0xc];
                            local_180[0xd] = (RTCHitN)auVar72[0xd];
                            local_180[0xe] = (RTCHitN)auVar72[0xe];
                            local_180[0xf] = (RTCHitN)auVar72[0xf];
                            local_180[0x10] = (RTCHitN)auVar72[0x10];
                            local_180[0x11] = (RTCHitN)auVar72[0x11];
                            local_180[0x12] = (RTCHitN)auVar72[0x12];
                            local_180[0x13] = (RTCHitN)auVar72[0x13];
                            local_180[0x14] = (RTCHitN)auVar72[0x14];
                            local_180[0x15] = (RTCHitN)auVar72[0x15];
                            local_180[0x16] = (RTCHitN)auVar72[0x16];
                            local_180[0x17] = (RTCHitN)auVar72[0x17];
                            local_180[0x18] = (RTCHitN)auVar72[0x18];
                            local_180[0x19] = (RTCHitN)auVar72[0x19];
                            local_180[0x1a] = (RTCHitN)auVar72[0x1a];
                            local_180[0x1b] = (RTCHitN)auVar72[0x1b];
                            local_180[0x1c] = (RTCHitN)auVar72[0x1c];
                            local_180[0x1d] = (RTCHitN)auVar72[0x1d];
                            local_180[0x1e] = (RTCHitN)auVar72[0x1e];
                            local_180[0x1f] = (RTCHitN)auVar72[0x1f];
                            uStack_13c = local_140;
                            uStack_138 = local_140;
                            uStack_134 = local_140;
                            uStack_130 = local_140;
                            uStack_12c = local_140;
                            uStack_128 = local_140;
                            uStack_124 = local_140;
                            fStack_11c = local_120;
                            fStack_118 = local_120;
                            fStack_114 = local_120;
                            fStack_110 = local_120;
                            fStack_10c = local_120;
                            fStack_108 = local_120;
                            fStack_104 = local_120;
                            local_e0 = local_200._0_8_;
                            uStack_d8 = local_200._8_8_;
                            uStack_d0 = local_200._16_8_;
                            uStack_c8 = local_200._24_8_;
                            local_c0 = local_220;
                            vpcmpeqd_avx2(local_220,local_220);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar212;
                            local_3e0 = local_240._0_8_;
                            uStack_3d8 = local_240._8_8_;
                            uStack_3d0 = local_240._16_8_;
                            uStack_3c8 = local_240._24_8_;
                            local_410.valid = (int *)&local_3e0;
                            local_410.geometryUserPtr = pGVar5->userPtr;
                            local_410.context = context->user;
                            local_410.ray = (RTCRayN *)ray;
                            local_410.hit = local_180;
                            local_410.N = 8;
                            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar5->occlusionFilterN)(&local_410);
                              auVar33 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
                              auVar253 = ZEXT1664(auVar33);
                              auVar250 = ZEXT464(0x3f800000);
                              auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              in_ZMM18 = ZEXT3264(auVar75);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar249 = ZEXT1664(auVar33);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar254 = ZEXT1664(auVar33);
                              auVar75._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar251 = ZEXT1664(auVar75._0_16_);
                            }
                            auVar33 = auVar253._0_16_;
                            auVar16._8_8_ = uStack_3d8;
                            auVar16._0_8_ = local_3e0;
                            auVar16._16_8_ = uStack_3d0;
                            auVar16._24_8_ = uStack_3c8;
                            if (auVar16 == (undefined1  [32])0x0) {
                              bVar28 = false;
                            }
                            else {
                              p_Var6 = context->args->filter;
                              if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var6)(&local_410);
                                auVar33 = vxorps_avx512vl(auVar33,auVar33);
                                auVar253 = ZEXT1664(auVar33);
                                auVar250 = ZEXT464(0x3f800000);
                                auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM18 = ZEXT3264(auVar75);
                                auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar249 = ZEXT1664(auVar33);
                                auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar254 = ZEXT1664(auVar33);
                                auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar251 = ZEXT1664(auVar33);
                              }
                              auVar17._8_8_ = uStack_3d8;
                              auVar17._0_8_ = local_3e0;
                              auVar17._16_8_ = uStack_3d0;
                              auVar17._24_8_ = uStack_3c8;
                              uVar25 = vptestmd_avx512vl(auVar17,auVar17);
                              auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar28 = (bool)((byte)uVar25 & 1);
                              auVar75._0_4_ =
                                   (uint)bVar28 * auVar72._0_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x100);
                              bVar28 = (bool)((byte)(uVar25 >> 1) & 1);
                              auVar75._4_4_ =
                                   (uint)bVar28 * auVar72._4_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x104);
                              bVar28 = (bool)((byte)(uVar25 >> 2) & 1);
                              auVar75._8_4_ =
                                   (uint)bVar28 * auVar72._8_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x108);
                              bVar28 = (bool)((byte)(uVar25 >> 3) & 1);
                              auVar75._12_4_ =
                                   (uint)bVar28 * auVar72._12_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x10c);
                              bVar28 = (bool)((byte)(uVar25 >> 4) & 1);
                              auVar75._16_4_ =
                                   (uint)bVar28 * auVar72._16_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x110);
                              bVar28 = (bool)((byte)(uVar25 >> 5) & 1);
                              auVar75._20_4_ =
                                   (uint)bVar28 * auVar72._20_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x114);
                              bVar28 = (bool)((byte)(uVar25 >> 6) & 1);
                              auVar75._24_4_ =
                                   (uint)bVar28 * auVar72._24_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x118);
                              bVar28 = SUB81(uVar25 >> 7,0);
                              auVar75._28_4_ =
                                   (uint)bVar28 * auVar72._28_4_ |
                                   (uint)!bVar28 * *(int *)(local_410.ray + 0x11c);
                              *(undefined1 (*) [32])(local_410.ray + 0x100) = auVar75;
                              bVar28 = auVar17 != (undefined1  [32])0x0;
                            }
                            if (!bVar28) {
                              *(float *)(ray + k * 4 + 0x100) = fVar214;
                            }
                          }
                          auVar236 = ZEXT1664(auVar37);
                          bVar27 = (bool)(bVar27 | bVar28);
                        }
                      }
                    }
                  }
                  goto LAB_01b7a9d7;
                }
                break;
              }
              lVar23 = lVar23 + -1;
            } while (lVar23 != 0);
          }
          auVar236 = ZEXT1664(auVar37);
        }
        else {
          auVar33 = vxorps_avx512vl(ZEXT416(5),auVar39);
          auVar253 = ZEXT1664(auVar33);
          auVar75._16_16_ = auVar81._16_16_;
          auVar75._0_16_ = auVar104;
        }
      }
LAB_01b7a9d7:
    } while (bVar11);
    auVar33 = vinsertps_avx512f(auVar68._0_16_,auVar36,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }